

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  _func_int ***ppp_Var1;
  float *pfVar2;
  _func_int ***ppp_Var3;
  float *pfVar4;
  _func_int ***ppp_Var5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [12];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  Primitive PVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [16];
  undefined6 uVar62;
  undefined1 auVar63 [12];
  unkbyte9 Var64;
  undefined1 auVar65 [13];
  undefined1 auVar66 [12];
  undefined1 auVar67 [13];
  undefined1 auVar68 [12];
  undefined1 auVar69 [13];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  undefined1 auVar73 [12];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  bool bVar90;
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  bool bVar95;
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  bool bVar100;
  bool bVar101;
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [13];
  undefined1 auVar119 [13];
  undefined1 auVar120 [13];
  undefined1 auVar121 [13];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [16];
  ulong uVar127;
  RTCFilterFunctionN p_Var128;
  RTCRayN *pRVar129;
  RTCIntersectArguments *pRVar130;
  ulong uVar131;
  long lVar132;
  RTCIntersectArguments *pRVar133;
  Geometry *pGVar134;
  undefined4 uVar135;
  long lVar137;
  long lVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  short sVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar150 [12];
  float fVar213;
  undefined1 auVar156 [16];
  char cVar220;
  undefined1 auVar160 [16];
  undefined1 auVar151 [12];
  undefined1 auVar164 [16];
  undefined1 auVar152 [12];
  undefined1 auVar168 [16];
  undefined1 auVar153 [12];
  undefined1 auVar172 [16];
  float fVar218;
  float fVar221;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar154 [12];
  undefined1 auVar182 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  float fVar219;
  float fVar222;
  undefined8 uVar223;
  float fVar224;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar203;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar204;
  undefined1 auVar205 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar206;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar207;
  undefined1 auVar208 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar209;
  undefined1 auVar210 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar211;
  float fVar225;
  float fVar226;
  float fVar268;
  float fVar270;
  vfloat4 v;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar269;
  float fVar271;
  float fVar272;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  int iVar273;
  int iVar274;
  int iVar275;
  char cVar303;
  undefined1 uVar304;
  int iVar305;
  undefined1 auVar279 [16];
  char cVar306;
  undefined1 auVar283 [16];
  undefined1 auVar287 [16];
  undefined1 auVar291 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar321;
  float fVar325;
  undefined1 auVar310 [16];
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  float fVar331;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar344;
  float fVar345;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  char cVar354;
  float fVar346;
  float fVar355;
  float fVar356;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar357;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  float fVar384;
  float fVar390;
  float fVar392;
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  float fVar391;
  float fVar393;
  undefined1 auVar388 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar389;
  float fVar399;
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar396;
  float fVar400;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar397;
  undefined1 auVar398 [16];
  float fVar401;
  float fVar402;
  float fVar403;
  float fVar409;
  float fVar412;
  float fVar413;
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  float fVar410;
  float fVar411;
  undefined1 auVar408 [16];
  float fVar414;
  float fVar415;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar424;
  float fVar425;
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  float fVar426;
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  float fVar430;
  float fVar431;
  float fVar434;
  float fVar435;
  float fVar436;
  float fVar438;
  float fVar439;
  float fVar442;
  float fVar443;
  undefined1 auVar432 [16];
  float fVar437;
  float fVar440;
  float fVar441;
  float fVar444;
  float fVar445;
  undefined1 auVar433 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 local_528 [6];
  undefined2 uStack_522;
  float fStack_520;
  undefined4 uStack_51c;
  char local_508;
  char cStack_507;
  undefined1 uStack_506;
  undefined1 uStack_505;
  char local_4e8;
  char cStack_4e7;
  undefined1 uStack_4e6;
  undefined1 uStack_4e5;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined2 local_488;
  undefined2 uStack_486;
  undefined2 uStack_484;
  undefined2 uStack_482;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  vbool<4> valid;
  undefined1 local_3f8 [16];
  RTCIntersectArguments *local_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  RTCFilterFunctionNArguments args;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar136;
  undefined1 auVar149 [12];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar180 [16];
  undefined1 auVar184 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar174 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined2 uVar212;
  int iVar214;
  int iVar215;
  int iVar216;
  int iVar217;
  undefined1 auVar229 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar276 [12];
  undefined1 auVar277 [12];
  undefined1 auVar278 [12];
  undefined1 auVar284 [16];
  undefined1 auVar288 [16];
  undefined1 auVar292 [16];
  undefined1 auVar282 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar293 [16];
  
  PVar20 = prim[1];
  uVar127 = (ulong)(byte)PVar20;
  lVar132 = uVar127 * 0x25;
  uVar135 = *(undefined4 *)(prim + uVar127 * 4 + 6);
  uVar21 = *(undefined4 *)(prim + uVar127 * 5 + 6);
  uVar22 = *(undefined4 *)(prim + uVar127 * 6 + 6);
  uVar9 = *(undefined4 *)(prim + uVar127 * 0xf + 6);
  uVar23 = *(undefined4 *)(prim + (ulong)(byte)PVar20 * 0x10 + 6);
  uVar24 = *(undefined4 *)(prim + uVar127 * 0x11 + 6);
  uVar10 = *(undefined4 *)(prim + uVar127 * 0x1a + 6);
  uVar11 = *(undefined4 *)(prim + uVar127 * 0x1b + 6);
  uVar25 = *(undefined4 *)(prim + uVar127 * 0x1c + 6);
  pPVar7 = prim + lVar132 + 6;
  fVar423 = *(float *)(pPVar7 + 0xc);
  fVar225 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar423;
  fVar268 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar423;
  fVar270 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar423;
  fVar414 = *(float *)(ray + k * 4 + 0x40) * fVar423;
  fVar421 = *(float *)(ray + k * 4 + 0x50) * fVar423;
  fVar423 = *(float *)(ray + k * 4 + 0x60) * fVar423;
  uVar304 = (undefined1)((uint)uVar21 >> 0x18);
  uVar212 = CONCAT11(uVar304,uVar304);
  uVar304 = (undefined1)((uint)uVar21 >> 0x10);
  uVar223 = CONCAT35(CONCAT21(uVar212,uVar304),CONCAT14(uVar304,uVar21));
  cVar303 = (char)((uint)uVar21 >> 8);
  uVar62 = CONCAT51(CONCAT41((int)((ulong)uVar223 >> 0x20),cVar303),cVar303);
  cVar220 = (char)uVar21;
  uVar136 = CONCAT62(uVar62,CONCAT11(cVar220,cVar220));
  auVar281._8_4_ = 0;
  auVar281._0_8_ = uVar136;
  auVar281._12_2_ = uVar212;
  auVar281._14_2_ = uVar212;
  uVar212 = (undefined2)((ulong)uVar223 >> 0x20);
  auVar280._12_4_ = auVar281._12_4_;
  auVar280._8_2_ = 0;
  auVar280._0_8_ = uVar136;
  auVar280._10_2_ = uVar212;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._8_2_ = uVar212;
  auVar279._0_8_ = uVar136;
  uVar212 = (undefined2)uVar62;
  auVar63._4_8_ = auVar279._8_8_;
  auVar63._2_2_ = uVar212;
  auVar63._0_2_ = uVar212;
  iVar273 = (int)CONCAT11(cVar220,cVar220) >> 8;
  iVar305 = auVar63._0_4_ >> 0x18;
  auVar276._0_8_ = CONCAT44(iVar305,iVar273);
  auVar276._8_4_ = auVar279._8_4_ >> 0x18;
  auVar282._12_4_ = auVar280._12_4_ >> 0x18;
  auVar282._0_12_ = auVar276;
  fVar399 = (float)iVar305;
  cVar306 = cVar303 >> 7;
  auVar29[0xd] = 0;
  auVar29._0_13_ = auVar282._0_13_;
  auVar29[0xe] = cVar306;
  auVar33[0xc] = cVar306;
  auVar33._0_12_ = auVar276;
  auVar33._13_2_ = auVar29._13_2_;
  auVar37[0xb] = 0;
  auVar37._0_11_ = auVar276._0_11_;
  auVar37._12_3_ = auVar33._12_3_;
  auVar41[10] = cVar306;
  auVar41._0_10_ = auVar276._0_10_;
  auVar41._11_4_ = auVar37._11_4_;
  auVar45[9] = 0;
  auVar45._0_9_ = auVar276._0_9_;
  auVar45._10_5_ = auVar41._10_5_;
  auVar49[8] = cVar303;
  auVar49._0_8_ = auVar276._0_8_;
  auVar49._9_6_ = auVar45._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar49._8_7_,(char)((uint)uVar22 >> 0x18)),(short)cVar220 >> 7);
  auVar53._6_9_ = Var64;
  auVar53[5] = (char)((uint)uVar22 >> 0x10);
  auVar53[4] = (undefined1)((short)cVar220 >> 7);
  auVar53._0_4_ = iVar273;
  cVar306 = (char)((uint)uVar22 >> 8);
  auVar65._2_11_ = auVar53._4_11_;
  auVar65[1] = cVar306;
  auVar65[0] = (undefined1)((short)cVar220 >> 7);
  cVar303 = (char)uVar22;
  auVar57._2_13_ = auVar65;
  auVar57._0_2_ = CONCAT11(cVar303,cVar220);
  uVar212 = (undefined2)Var64;
  auVar285._0_12_ = auVar57._0_12_;
  auVar285._12_2_ = uVar212;
  auVar285._14_2_ = uVar212;
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._0_10_ = auVar57._0_10_;
  auVar284._10_2_ = auVar53._4_2_;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._0_8_ = auVar57._0_8_;
  auVar283._8_2_ = auVar53._4_2_;
  auVar66._4_8_ = auVar283._8_8_;
  auVar66._2_2_ = auVar65._0_2_;
  auVar66._0_2_ = auVar65._0_2_;
  iVar274 = (int)CONCAT11(cVar303,cVar220) >> 8;
  iVar305 = auVar66._0_4_ >> 0x18;
  auVar277._0_8_ = CONCAT44(iVar305,iVar274);
  auVar277._8_4_ = auVar283._8_4_ >> 0x18;
  auVar286._12_4_ = auVar284._12_4_ >> 0x18;
  auVar286._0_12_ = auVar277;
  fVar434 = (float)iVar305;
  cVar220 = cVar306 >> 7;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar286._0_13_;
  auVar30[0xe] = cVar220;
  auVar34[0xc] = cVar220;
  auVar34._0_12_ = auVar277;
  auVar34._13_2_ = auVar30._13_2_;
  auVar38[0xb] = 0;
  auVar38._0_11_ = auVar277._0_11_;
  auVar38._12_3_ = auVar34._12_3_;
  auVar42[10] = cVar220;
  auVar42._0_10_ = auVar277._0_10_;
  auVar42._11_4_ = auVar38._11_4_;
  auVar46[9] = 0;
  auVar46._0_9_ = auVar277._0_9_;
  auVar46._10_5_ = auVar42._10_5_;
  auVar50[8] = cVar306;
  auVar50._0_8_ = auVar277._0_8_;
  auVar50._9_6_ = auVar46._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar50._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar303 >> 7);
  auVar54._6_9_ = Var64;
  auVar54[5] = (char)((uint)uVar23 >> 0x10);
  auVar54[4] = (undefined1)((short)cVar303 >> 7);
  auVar54._0_4_ = iVar274;
  cVar354 = (char)((uint)uVar23 >> 8);
  auVar67._2_11_ = auVar54._4_11_;
  auVar67[1] = cVar354;
  auVar67[0] = (undefined1)((short)cVar303 >> 7);
  cVar306 = (char)uVar23;
  auVar58._2_13_ = auVar67;
  auVar58._0_2_ = CONCAT11(cVar306,cVar303);
  uVar212 = (undefined2)Var64;
  auVar289._0_12_ = auVar58._0_12_;
  auVar289._12_2_ = uVar212;
  auVar289._14_2_ = uVar212;
  auVar288._12_4_ = auVar289._12_4_;
  auVar288._0_10_ = auVar58._0_10_;
  auVar288._10_2_ = auVar54._4_2_;
  auVar287._10_6_ = auVar288._10_6_;
  auVar287._0_8_ = auVar58._0_8_;
  auVar287._8_2_ = auVar54._4_2_;
  auVar68._4_8_ = auVar287._8_8_;
  auVar68._2_2_ = auVar67._0_2_;
  auVar68._0_2_ = auVar67._0_2_;
  iVar275 = (int)CONCAT11(cVar306,cVar303) >> 8;
  iVar305 = auVar68._0_4_ >> 0x18;
  auVar278._0_8_ = CONCAT44(iVar305,iVar275);
  auVar278._8_4_ = auVar287._8_4_ >> 0x18;
  auVar290._12_4_ = auVar288._12_4_ >> 0x18;
  auVar290._0_12_ = auVar278;
  fVar390 = (float)iVar305;
  cVar220 = cVar354 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar290._0_13_;
  auVar31[0xe] = cVar220;
  auVar35[0xc] = cVar220;
  auVar35._0_12_ = auVar278;
  auVar35._13_2_ = auVar31._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar278._0_11_;
  auVar39._12_3_ = auVar35._12_3_;
  auVar43[10] = cVar220;
  auVar43._0_10_ = auVar278._0_10_;
  auVar43._11_4_ = auVar39._11_4_;
  auVar47[9] = 0;
  auVar47._0_9_ = auVar278._0_9_;
  auVar47._10_5_ = auVar43._10_5_;
  auVar51[8] = cVar354;
  auVar51._0_8_ = auVar278._0_8_;
  auVar51._9_6_ = auVar47._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar51._8_7_,(char)((uint)uVar24 >> 0x18)),(short)cVar306 >> 7);
  auVar55._6_9_ = Var64;
  auVar55[5] = (char)((uint)uVar24 >> 0x10);
  auVar55[4] = (undefined1)((short)cVar306 >> 7);
  auVar55._0_4_ = iVar275;
  auVar69._2_11_ = auVar55._4_11_;
  auVar69[1] = (char)((uint)uVar24 >> 8);
  auVar69[0] = (undefined1)((short)cVar306 >> 7);
  sVar145 = CONCAT11((char)uVar24,cVar306);
  auVar59._2_13_ = auVar69;
  auVar59._0_2_ = sVar145;
  uVar212 = (undefined2)Var64;
  auVar293._0_12_ = auVar59._0_12_;
  auVar293._12_2_ = uVar212;
  auVar293._14_2_ = uVar212;
  auVar292._12_4_ = auVar293._12_4_;
  auVar292._0_10_ = auVar59._0_10_;
  auVar292._10_2_ = auVar55._4_2_;
  auVar291._10_6_ = auVar292._10_6_;
  auVar291._0_8_ = auVar59._0_8_;
  auVar291._8_2_ = auVar55._4_2_;
  auVar70._4_8_ = auVar291._8_8_;
  auVar70._2_2_ = auVar69._0_2_;
  auVar70._0_2_ = auVar69._0_2_;
  fVar331 = (float)((int)sVar145 >> 8);
  fVar341 = (float)(auVar70._0_4_ >> 0x18);
  fVar343 = (float)(auVar291._8_4_ >> 0x18);
  fVar146 = fVar423 * fVar331;
  fVar213 = fVar423 * fVar341;
  auVar149._0_8_ = CONCAT44(fVar213,fVar146);
  auVar149._8_4_ = fVar423 * fVar343;
  auVar155._12_4_ = fVar423 * (float)(auVar292._12_4_ >> 0x18);
  auVar155._0_12_ = auVar149;
  fVar426 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar132 + 0x16)) *
            *(float *)(prim + lVar132 + 0x1a);
  local_4e8 = (char)uVar135;
  cStack_4e7 = (char)((uint)uVar135 >> 8);
  uStack_4e6 = (undefined1)((uint)uVar135 >> 0x10);
  uStack_4e5 = (undefined1)((uint)uVar135 >> 0x18);
  auVar86[0xd] = 0;
  auVar86._0_13_ = auVar155._0_13_;
  auVar86[0xe] = (char)((uint)fVar213 >> 0x18);
  auVar91[0xc] = (char)((uint)fVar213 >> 0x10);
  auVar91._0_12_ = auVar149;
  auVar91._13_2_ = auVar86._13_2_;
  auVar96[0xb] = 0;
  auVar96._0_11_ = auVar149._0_11_;
  auVar96._12_3_ = auVar91._12_3_;
  auVar102[10] = (char)((uint)fVar213 >> 8);
  auVar102._0_10_ = auVar149._0_10_;
  auVar102._11_4_ = auVar96._11_4_;
  auVar106[9] = 0;
  auVar106._0_9_ = auVar149._0_9_;
  auVar106._10_5_ = auVar102._10_5_;
  auVar110[8] = SUB41(fVar213,0);
  auVar110._0_8_ = auVar149._0_8_;
  auVar110._9_6_ = auVar106._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar110._8_7_,uStack_4e5),(char)((uint)fVar146 >> 0x18));
  auVar114._6_9_ = Var64;
  auVar114[5] = uStack_4e6;
  auVar114[4] = (char)((uint)fVar146 >> 0x10);
  auVar114._0_4_ = fVar146;
  auVar118._2_11_ = auVar114._4_11_;
  auVar118[1] = cStack_4e7;
  auVar118[0] = (char)((uint)fVar146 >> 8);
  sVar145 = CONCAT11(local_4e8,SUB41(fVar146,0));
  auVar122._2_13_ = auVar118;
  auVar122._0_2_ = sVar145;
  uVar212 = (undefined2)Var64;
  auVar158._0_12_ = auVar122._0_12_;
  auVar158._12_2_ = uVar212;
  auVar158._14_2_ = uVar212;
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._0_10_ = auVar122._0_10_;
  auVar157._10_2_ = auVar114._4_2_;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._0_8_ = auVar122._0_8_;
  auVar156._8_2_ = auVar114._4_2_;
  auVar71._4_8_ = auVar156._8_8_;
  auVar71._2_2_ = auVar118._0_2_;
  auVar71._0_2_ = auVar118._0_2_;
  iVar305 = (int)sVar145 >> 8;
  iVar214 = auVar71._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar214,iVar305);
  auVar150._8_4_ = auVar156._8_4_ >> 0x18;
  auVar159._12_4_ = auVar157._12_4_ >> 0x18;
  auVar159._0_12_ = auVar150;
  fVar368 = (float)iVar214;
  local_488._0_1_ = (char)uVar9;
  local_488._1_1_ = (char)((uint)uVar9 >> 8);
  uStack_486._0_1_ = (undefined1)((uint)uVar9 >> 0x10);
  uStack_486._1_1_ = (undefined1)((uint)uVar9 >> 0x18);
  cVar220 = cStack_4e7 >> 7;
  auVar87[0xd] = 0;
  auVar87._0_13_ = auVar159._0_13_;
  auVar87[0xe] = cVar220;
  auVar92[0xc] = cVar220;
  auVar92._0_12_ = auVar150;
  auVar92._13_2_ = auVar87._13_2_;
  auVar97[0xb] = 0;
  auVar97._0_11_ = auVar150._0_11_;
  auVar97._12_3_ = auVar92._12_3_;
  auVar103[10] = cVar220;
  auVar103._0_10_ = auVar150._0_10_;
  auVar103._11_4_ = auVar97._11_4_;
  auVar107[9] = 0;
  auVar107._0_9_ = auVar150._0_9_;
  auVar107._10_5_ = auVar103._10_5_;
  auVar111[8] = cStack_4e7;
  auVar111._0_8_ = auVar150._0_8_;
  auVar111._9_6_ = auVar107._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar111._8_7_,uStack_486._1_1_),(short)local_4e8 >> 7);
  auVar115._6_9_ = Var64;
  auVar115[5] = (undefined1)uStack_486;
  auVar115[4] = (undefined1)((short)local_4e8 >> 7);
  auVar115._0_4_ = iVar305;
  auVar119._2_11_ = auVar115._4_11_;
  auVar119[1] = local_488._1_1_;
  auVar119[0] = (undefined1)((short)local_4e8 >> 7);
  auVar123._2_13_ = auVar119;
  auVar123._0_2_ = CONCAT11((char)local_488,local_4e8);
  uVar212 = (undefined2)Var64;
  auVar162._0_12_ = auVar123._0_12_;
  auVar162._12_2_ = uVar212;
  auVar162._14_2_ = uVar212;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar123._0_10_;
  auVar161._10_2_ = auVar115._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar123._0_8_;
  auVar160._8_2_ = auVar115._4_2_;
  auVar72._4_8_ = auVar160._8_8_;
  auVar72._2_2_ = auVar119._0_2_;
  auVar72._0_2_ = auVar119._0_2_;
  iVar214 = (int)CONCAT11((char)local_488,local_4e8) >> 8;
  iVar215 = auVar72._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar215,iVar214);
  auVar151._8_4_ = auVar160._8_4_ >> 0x18;
  auVar163._12_4_ = auVar161._12_4_ >> 0x18;
  auVar163._0_12_ = auVar151;
  fVar360 = (float)iVar215;
  local_528[0] = (char)uVar10;
  local_528[1] = (char)((uint)uVar10 >> 8);
  local_528[2] = (undefined1)((uint)uVar10 >> 0x10);
  local_528[3] = (undefined1)((uint)uVar10 >> 0x18);
  cVar220 = local_488._1_1_ >> 7;
  auVar88[0xd] = 0;
  auVar88._0_13_ = auVar163._0_13_;
  auVar88[0xe] = cVar220;
  auVar93[0xc] = cVar220;
  auVar93._0_12_ = auVar151;
  auVar93._13_2_ = auVar88._13_2_;
  auVar98[0xb] = 0;
  auVar98._0_11_ = auVar151._0_11_;
  auVar98._12_3_ = auVar93._12_3_;
  auVar104[10] = cVar220;
  auVar104._0_10_ = auVar151._0_10_;
  auVar104._11_4_ = auVar98._11_4_;
  auVar108[9] = 0;
  auVar108._0_9_ = auVar151._0_9_;
  auVar108._10_5_ = auVar104._10_5_;
  auVar112[8] = local_488._1_1_;
  auVar112._0_8_ = auVar151._0_8_;
  auVar112._9_6_ = auVar108._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar112._8_7_,local_528[3]),(short)(char)local_488 >> 7);
  auVar116._6_9_ = Var64;
  auVar116[5] = local_528[2];
  auVar116[4] = (undefined1)((short)(char)local_488 >> 7);
  auVar116._0_4_ = iVar214;
  auVar120._2_11_ = auVar116._4_11_;
  auVar120[1] = local_528[1];
  auVar120[0] = (undefined1)((short)(char)local_488 >> 7);
  auVar124._2_13_ = auVar120;
  auVar124._0_2_ = CONCAT11(local_528[0],(char)local_488);
  uVar212 = (undefined2)Var64;
  auVar166._0_12_ = auVar124._0_12_;
  auVar166._12_2_ = uVar212;
  auVar166._14_2_ = uVar212;
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._0_10_ = auVar124._0_10_;
  auVar165._10_2_ = auVar116._4_2_;
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._0_8_ = auVar124._0_8_;
  auVar164._8_2_ = auVar116._4_2_;
  auVar73._4_8_ = auVar164._8_8_;
  auVar73._2_2_ = auVar120._0_2_;
  auVar73._0_2_ = auVar120._0_2_;
  iVar215 = (int)CONCAT11(local_528[0],(char)local_488) >> 8;
  iVar216 = auVar73._0_4_ >> 0x18;
  auVar152._0_8_ = CONCAT44(iVar216,iVar215);
  auVar152._8_4_ = auVar164._8_4_ >> 0x18;
  auVar167._12_4_ = auVar165._12_4_ >> 0x18;
  auVar167._0_12_ = auVar152;
  fVar342 = (float)iVar216;
  local_508 = (char)uVar11;
  cStack_507 = (char)((uint)uVar11 >> 8);
  uStack_506 = (undefined1)((uint)uVar11 >> 0x10);
  uStack_505 = (undefined1)((uint)uVar11 >> 0x18);
  cVar220 = local_528[1] >> 7;
  auVar89[0xd] = 0;
  auVar89._0_13_ = auVar167._0_13_;
  auVar89[0xe] = cVar220;
  auVar94[0xc] = cVar220;
  auVar94._0_12_ = auVar152;
  auVar94._13_2_ = auVar89._13_2_;
  auVar99[0xb] = 0;
  auVar99._0_11_ = auVar152._0_11_;
  auVar99._12_3_ = auVar94._12_3_;
  auVar105[10] = cVar220;
  auVar105._0_10_ = auVar152._0_10_;
  auVar105._11_4_ = auVar99._11_4_;
  auVar109[9] = 0;
  auVar109._0_9_ = auVar152._0_9_;
  auVar109._10_5_ = auVar105._10_5_;
  auVar113[8] = local_528[1];
  auVar113._0_8_ = auVar152._0_8_;
  auVar113._9_6_ = auVar109._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar113._8_7_,uStack_505),(short)local_528[0] >> 7);
  auVar117._6_9_ = Var64;
  auVar117[5] = uStack_506;
  auVar117[4] = (undefined1)((short)local_528[0] >> 7);
  auVar117._0_4_ = iVar215;
  auVar121._2_11_ = auVar117._4_11_;
  auVar121[1] = cStack_507;
  auVar121[0] = (undefined1)((short)local_528[0] >> 7);
  auVar125._2_13_ = auVar121;
  auVar125._0_2_ = CONCAT11(local_508,local_528[0]);
  uVar212 = (undefined2)Var64;
  auVar170._0_12_ = auVar125._0_12_;
  auVar170._12_2_ = uVar212;
  auVar170._14_2_ = uVar212;
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._0_10_ = auVar125._0_10_;
  auVar169._10_2_ = auVar117._4_2_;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._0_8_ = auVar125._0_8_;
  auVar168._8_2_ = auVar117._4_2_;
  auVar74._4_8_ = auVar168._8_8_;
  auVar74._2_2_ = auVar121._0_2_;
  auVar74._0_2_ = auVar121._0_2_;
  iVar216 = (int)CONCAT11(local_508,local_528[0]) >> 8;
  iVar217 = auVar74._0_4_ >> 0x18;
  auVar153._0_8_ = CONCAT44(iVar217,iVar216);
  auVar153._8_4_ = auVar168._8_4_ >> 0x18;
  auVar171._12_4_ = auVar169._12_4_ >> 0x18;
  auVar171._0_12_ = auVar153;
  fVar321 = (float)iVar217;
  cVar220 = cStack_507 >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar171._0_13_;
  auVar32[0xe] = cVar220;
  auVar36[0xc] = cVar220;
  auVar36._0_12_ = auVar153;
  auVar36._13_2_ = auVar32._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar153._0_11_;
  auVar40._12_3_ = auVar36._12_3_;
  auVar44[10] = cVar220;
  auVar44._0_10_ = auVar153._0_10_;
  auVar44._11_4_ = auVar40._11_4_;
  auVar48[9] = 0;
  auVar48._0_9_ = auVar153._0_9_;
  auVar48._10_5_ = auVar44._10_5_;
  auVar52[8] = cStack_507;
  auVar52._0_8_ = auVar153._0_8_;
  auVar52._9_6_ = auVar48._9_6_;
  Var64 = CONCAT81(CONCAT71(auVar52._8_7_,(char)((uint)uVar25 >> 0x18)),(short)local_508 >> 7);
  auVar56._6_9_ = Var64;
  auVar56[5] = (char)((uint)uVar25 >> 0x10);
  auVar56[4] = (undefined1)((short)local_508 >> 7);
  auVar56._0_4_ = iVar216;
  auVar75._2_11_ = auVar56._4_11_;
  auVar75[1] = (char)((uint)uVar25 >> 8);
  auVar75[0] = (undefined1)((short)local_508 >> 7);
  sVar145 = CONCAT11((char)uVar25,local_508);
  auVar60._2_13_ = auVar75;
  auVar60._0_2_ = sVar145;
  uVar212 = (undefined2)Var64;
  auVar174._0_12_ = auVar60._0_12_;
  auVar174._12_2_ = uVar212;
  auVar174._14_2_ = uVar212;
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._0_10_ = auVar60._0_10_;
  auVar173._10_2_ = auVar56._4_2_;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._0_8_ = auVar60._0_8_;
  auVar172._8_2_ = auVar56._4_2_;
  auVar76._4_8_ = auVar172._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  fVar147 = (float)((int)sVar145 >> 8);
  fVar218 = (float)(auVar76._0_4_ >> 0x18);
  fVar221 = (float)(auVar172._8_4_ >> 0x18);
  fVar415 = fVar414 * (float)iVar305 + fVar421 * (float)iVar273 + fVar423 * (float)iVar274;
  fVar422 = fVar414 * fVar368 + fVar421 * fVar399 + fVar423 * fVar434;
  fVar424 = fVar414 * (float)auVar150._8_4_ +
            fVar421 * (float)auVar276._8_4_ + fVar423 * (float)auVar277._8_4_;
  fVar425 = fVar414 * (float)auVar159._12_4_ +
            fVar421 * (float)auVar282._12_4_ + fVar423 * (float)auVar286._12_4_;
  fVar401 = fVar414 * (float)iVar214 + fVar421 * (float)iVar275 + fVar146;
  fVar409 = fVar414 * fVar360 + fVar421 * fVar390 + fVar213;
  fVar412 = fVar414 * (float)auVar151._8_4_ + fVar421 * (float)auVar278._8_4_ + auVar149._8_4_;
  fVar413 = fVar414 * (float)auVar163._12_4_ + fVar421 * (float)auVar290._12_4_ + auVar155._12_4_;
  fVar346 = fVar414 * (float)iVar215 + fVar421 * (float)iVar216 + fVar423 * fVar147;
  fVar355 = fVar414 * fVar342 + fVar421 * fVar321 + fVar423 * fVar218;
  fVar356 = fVar414 * (float)auVar152._8_4_ + fVar421 * (float)auVar153._8_4_ + fVar423 * fVar221;
  fVar414 = fVar414 * (float)auVar167._12_4_ +
            fVar421 * (float)auVar171._12_4_ + fVar423 * (float)(auVar173._12_4_ >> 0x18);
  uVar223 = *(undefined8 *)(prim + uVar127 * 7 + 6);
  uVar12 = *(undefined8 *)(prim + uVar127 * 0xb + 6);
  uVar13 = *(undefined8 *)(prim + uVar127 * 9 + 6);
  fVar364 = (float)iVar305 * fVar225 + (float)iVar273 * fVar268 + (float)iVar274 * fVar270;
  fVar434 = fVar368 * fVar225 + fVar399 * fVar268 + fVar434 * fVar270;
  fVar372 = (float)auVar150._8_4_ * fVar225 +
            (float)auVar276._8_4_ * fVar268 + (float)auVar277._8_4_ * fVar270;
  fVar375 = (float)auVar159._12_4_ * fVar225 +
            (float)auVar282._12_4_ * fVar268 + (float)auVar286._12_4_ * fVar270;
  fVar378 = (float)iVar214 * fVar225 + (float)iVar275 * fVar268 + fVar331 * fVar270;
  fVar379 = fVar360 * fVar225 + fVar390 * fVar268 + fVar341 * fVar270;
  fVar380 = (float)auVar151._8_4_ * fVar225 + (float)auVar278._8_4_ * fVar268 + fVar343 * fVar270;
  fVar381 = (float)auVar163._12_4_ * fVar225 +
            (float)auVar290._12_4_ * fVar268 + (float)(auVar292._12_4_ >> 0x18) * fVar270;
  fVar368 = fVar225 * (float)iVar215 + fVar268 * (float)iVar216 + fVar270 * fVar147;
  fVar390 = fVar225 * fVar342 + fVar268 * fVar321 + fVar270 * fVar218;
  fVar399 = fVar225 * (float)auVar152._8_4_ + fVar268 * (float)auVar153._8_4_ + fVar270 * fVar221;
  fVar421 = fVar225 * (float)auVar167._12_4_ +
            fVar268 * (float)auVar171._12_4_ + fVar270 * (float)(auVar173._12_4_ >> 0x18);
  fVar423 = (float)DAT_01f4bd50;
  fVar146 = DAT_01f4bd50._4_4_;
  fVar147 = DAT_01f4bd50._8_4_;
  fVar213 = DAT_01f4bd50._12_4_;
  uVar139 = -(uint)(fVar423 <= ABS(fVar415));
  uVar140 = -(uint)(fVar146 <= ABS(fVar422));
  uVar141 = -(uint)(fVar147 <= ABS(fVar424));
  uVar142 = -(uint)(fVar213 <= ABS(fVar425));
  auVar416._0_4_ = (uint)fVar415 & uVar139;
  auVar416._4_4_ = (uint)fVar422 & uVar140;
  auVar416._8_4_ = (uint)fVar424 & uVar141;
  auVar416._12_4_ = (uint)fVar425 & uVar142;
  auVar175._0_4_ = ~uVar139 & (uint)fVar423;
  auVar175._4_4_ = ~uVar140 & (uint)fVar146;
  auVar175._8_4_ = ~uVar141 & (uint)fVar147;
  auVar175._12_4_ = ~uVar142 & (uint)fVar213;
  auVar175 = auVar175 | auVar416;
  uVar139 = -(uint)(fVar423 <= ABS(fVar401));
  uVar140 = -(uint)(fVar146 <= ABS(fVar409));
  uVar141 = -(uint)(fVar147 <= ABS(fVar412));
  uVar142 = -(uint)(fVar213 <= ABS(fVar413));
  auVar404._0_4_ = (uint)fVar401 & uVar139;
  auVar404._4_4_ = (uint)fVar409 & uVar140;
  auVar404._8_4_ = (uint)fVar412 & uVar141;
  auVar404._12_4_ = (uint)fVar413 & uVar142;
  auVar332._0_4_ = ~uVar139 & (uint)fVar423;
  auVar332._4_4_ = ~uVar140 & (uint)fVar146;
  auVar332._8_4_ = ~uVar141 & (uint)fVar147;
  auVar332._12_4_ = ~uVar142 & (uint)fVar213;
  auVar332 = auVar332 | auVar404;
  uVar139 = -(uint)(fVar423 <= ABS(fVar346));
  uVar140 = -(uint)(fVar146 <= ABS(fVar355));
  uVar141 = -(uint)(fVar147 <= ABS(fVar356));
  uVar142 = -(uint)(fVar213 <= ABS(fVar414));
  auVar347._0_4_ = (uint)fVar346 & uVar139;
  auVar347._4_4_ = (uint)fVar355 & uVar140;
  auVar347._8_4_ = (uint)fVar356 & uVar141;
  auVar347._12_4_ = (uint)fVar414 & uVar142;
  auVar394._0_4_ = ~uVar139 & (uint)fVar423;
  auVar394._4_4_ = ~uVar140 & (uint)fVar146;
  auVar394._8_4_ = ~uVar141 & (uint)fVar147;
  auVar394._12_4_ = ~uVar142 & (uint)fVar213;
  auVar394 = auVar394 | auVar347;
  auVar227 = rcpps(_DAT_01f4bd50,auVar175);
  auVar228._0_4_ = auVar227._0_4_;
  auVar176._0_4_ = auVar175._0_4_ * auVar228._0_4_;
  fVar356 = auVar227._4_4_;
  auVar176._4_4_ = auVar175._4_4_ * fVar356;
  fVar414 = auVar227._8_4_;
  auVar176._8_4_ = auVar175._8_4_ * fVar414;
  fVar360 = auVar227._12_4_;
  auVar176._12_4_ = auVar175._12_4_ * fVar360;
  fVar401 = (1.0 - auVar176._0_4_) * auVar228._0_4_ + auVar228._0_4_;
  fVar356 = (1.0 - auVar176._4_4_) * fVar356 + fVar356;
  fVar414 = (1.0 - auVar176._8_4_) * fVar414 + fVar414;
  fVar360 = (1.0 - auVar176._12_4_) * fVar360 + fVar360;
  auVar177 = rcpps(auVar176,auVar332);
  fVar423 = auVar177._0_4_;
  fVar146 = auVar177._4_4_;
  fVar270 = auVar177._8_4_;
  fVar346 = auVar177._12_4_;
  fVar423 = (1.0 - auVar332._0_4_ * fVar423) * fVar423 + fVar423;
  fVar146 = (1.0 - auVar332._4_4_ * fVar146) * fVar146 + fVar146;
  fVar270 = (1.0 - auVar332._8_4_ * fVar270) * fVar270 + fVar270;
  fVar346 = (1.0 - auVar332._12_4_ * fVar346) * fVar346 + fVar346;
  auVar177 = rcpps(auVar177,auVar394);
  auVar178._0_4_ = auVar177._0_4_;
  fVar147 = auVar177._4_4_;
  fVar321 = auVar177._8_4_;
  fVar355 = auVar177._12_4_;
  fVar409 = (1.0 - auVar394._0_4_ * auVar178._0_4_) * auVar178._0_4_ + auVar178._0_4_;
  fVar147 = (1.0 - auVar394._4_4_ * fVar147) * fVar147 + fVar147;
  fVar321 = (1.0 - auVar394._8_4_ * fVar321) * fVar321 + fVar321;
  fVar355 = (1.0 - auVar394._12_4_ * fVar355) * fVar355 + fVar355;
  local_488 = (short)uVar223;
  uStack_486 = (undefined2)((ulong)uVar223 >> 0x10);
  uStack_484 = (undefined2)((ulong)uVar223 >> 0x20);
  uStack_482 = (undefined2)((ulong)uVar223 >> 0x30);
  auVar181._0_12_ = auVar177._0_12_;
  auVar181._12_2_ = auVar177._6_2_;
  auVar181._14_2_ = uStack_482;
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._0_10_ = auVar177._0_10_;
  auVar180._10_2_ = uStack_484;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._0_8_ = auVar177._0_8_;
  auVar179._8_2_ = auVar177._4_2_;
  auVar178._8_8_ = auVar179._8_8_;
  auVar178._6_2_ = uStack_486;
  auVar178._4_2_ = auVar177._2_2_;
  auVar182._0_4_ = (float)(int)local_488;
  fVar213 = (float)(auVar178._4_4_ >> 0x10);
  auVar154._0_8_ = CONCAT44(fVar213,auVar182._0_4_);
  auVar154._8_4_ = (float)(auVar179._8_4_ >> 0x10);
  local_528._0_2_ = (undefined2)uVar12;
  local_528._2_2_ = (undefined2)((ulong)uVar12 >> 0x10);
  local_528._4_2_ = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_522 = (undefined2)((ulong)uVar12 >> 0x30);
  auVar231._0_12_ = auVar227._0_12_;
  auVar231._12_2_ = auVar227._6_2_;
  auVar231._14_2_ = uStack_522;
  auVar230._12_4_ = auVar231._12_4_;
  auVar230._0_10_ = auVar227._0_10_;
  auVar230._10_2_ = local_528._4_2_;
  auVar229._10_6_ = auVar230._10_6_;
  auVar229._0_8_ = auVar227._0_8_;
  auVar229._8_2_ = auVar227._4_2_;
  auVar228._8_8_ = auVar229._8_8_;
  auVar228._6_2_ = local_528._2_2_;
  auVar228._4_2_ = auVar227._2_2_;
  auVar185._12_2_ = (short)((uint)fVar213 >> 0x10);
  auVar185._0_12_ = auVar154;
  auVar185._14_2_ = (short)((ulong)uVar13 >> 0x30);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._0_10_ = auVar154._0_10_;
  auVar184._10_2_ = (short)((ulong)uVar13 >> 0x20);
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = SUB42(fVar213,0);
  auVar183._0_8_ = auVar154._0_8_;
  auVar182._8_8_ = auVar183._8_8_;
  auVar182._6_2_ = (short)((ulong)uVar13 >> 0x10);
  auVar182._4_2_ = (short)((uint)auVar182._0_4_ >> 0x10);
  fVar218 = (float)(auVar182._4_4_ >> 0x10);
  fVar331 = (float)(auVar183._8_4_ >> 0x10);
  uVar136 = *(ulong *)(prim + uVar127 * 0xd + 6);
  uVar212 = (undefined2)(uVar136 >> 0x30);
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar136;
  auVar234._12_2_ = uVar212;
  auVar234._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar136 >> 0x20);
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._8_2_ = 0;
  auVar233._0_8_ = uVar136;
  auVar233._10_2_ = uVar212;
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._8_2_ = uVar212;
  auVar232._0_8_ = uVar136;
  uVar212 = (undefined2)(uVar136 >> 0x10);
  auVar77._4_8_ = auVar232._8_8_;
  auVar77._2_2_ = uVar212;
  auVar77._0_2_ = uVar212;
  uVar131 = *(ulong *)(prim + uVar127 * 0x12 + 6);
  uVar212 = (undefined2)(uVar131 >> 0x30);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar131;
  auVar188._12_2_ = uVar212;
  auVar188._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar131 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar131;
  auVar187._10_2_ = uVar212;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar212;
  auVar186._0_8_ = uVar131;
  uVar212 = (undefined2)(uVar131 >> 0x10);
  auVar78._4_8_ = auVar186._8_8_;
  auVar78._2_2_ = uVar212;
  auVar78._0_2_ = uVar212;
  fVar221 = (float)(auVar78._0_4_ >> 0x10);
  fVar341 = (float)(auVar186._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar127 * 0x16 + 6);
  uVar212 = (undefined2)(uVar14 >> 0x30);
  auVar237._8_4_ = 0;
  auVar237._0_8_ = uVar14;
  auVar237._12_2_ = uVar212;
  auVar237._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar14 >> 0x20);
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._8_2_ = 0;
  auVar236._0_8_ = uVar14;
  auVar236._10_2_ = uVar212;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._8_2_ = uVar212;
  auVar235._0_8_ = uVar14;
  uVar212 = (undefined2)(uVar14 >> 0x10);
  auVar79._4_8_ = auVar235._8_8_;
  auVar79._2_2_ = uVar212;
  auVar79._0_2_ = uVar212;
  uVar15 = *(ulong *)(prim + uVar127 * 0x14 + 6);
  uVar212 = (undefined2)(uVar15 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar15;
  auVar191._12_2_ = uVar212;
  auVar191._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar15 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar15;
  auVar190._10_2_ = uVar212;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar212;
  auVar189._0_8_ = uVar15;
  uVar212 = (undefined2)(uVar15 >> 0x10);
  auVar80._4_8_ = auVar189._8_8_;
  auVar80._2_2_ = uVar212;
  auVar80._0_2_ = uVar212;
  fVar225 = (float)(auVar80._0_4_ >> 0x10);
  fVar342 = (float)(auVar189._8_4_ >> 0x10);
  uVar16 = *(ulong *)(prim + uVar127 * 0x18 + 6);
  uVar212 = (undefined2)(uVar16 >> 0x30);
  auVar240._8_4_ = 0;
  auVar240._0_8_ = uVar16;
  auVar240._12_2_ = uVar212;
  auVar240._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar16 >> 0x20);
  auVar239._12_4_ = auVar240._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar16;
  auVar239._10_2_ = uVar212;
  auVar238._10_6_ = auVar239._10_6_;
  auVar238._8_2_ = uVar212;
  auVar238._0_8_ = uVar16;
  uVar212 = (undefined2)(uVar16 >> 0x10);
  auVar81._4_8_ = auVar238._8_8_;
  auVar81._2_2_ = uVar212;
  auVar81._0_2_ = uVar212;
  uVar17 = *(ulong *)(prim + uVar127 * 0x1d + 6);
  uVar212 = (undefined2)(uVar17 >> 0x30);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar17;
  auVar194._12_2_ = uVar212;
  auVar194._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar17 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar17;
  auVar193._10_2_ = uVar212;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar212;
  auVar192._0_8_ = uVar17;
  uVar212 = (undefined2)(uVar17 >> 0x10);
  auVar82._4_8_ = auVar192._8_8_;
  auVar82._2_2_ = uVar212;
  auVar82._0_2_ = uVar212;
  fVar268 = (float)(auVar82._0_4_ >> 0x10);
  fVar343 = (float)(auVar192._8_4_ >> 0x10);
  uVar18 = *(ulong *)(prim + uVar127 * 0x21 + 6);
  uVar212 = (undefined2)(uVar18 >> 0x30);
  auVar243._8_4_ = 0;
  auVar243._0_8_ = uVar18;
  auVar243._12_2_ = uVar212;
  auVar243._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar18 >> 0x20);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._8_2_ = 0;
  auVar242._0_8_ = uVar18;
  auVar242._10_2_ = uVar212;
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = uVar212;
  auVar241._0_8_ = uVar18;
  uVar212 = (undefined2)(uVar18 >> 0x10);
  auVar83._4_8_ = auVar241._8_8_;
  auVar83._2_2_ = uVar212;
  auVar83._0_2_ = uVar212;
  uVar19 = *(ulong *)(prim + uVar127 * 0x1f + 6);
  uVar212 = (undefined2)(uVar19 >> 0x30);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar19;
  auVar197._12_2_ = uVar212;
  auVar197._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar19 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar19;
  auVar196._10_2_ = uVar212;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar212;
  auVar195._0_8_ = uVar19;
  uVar212 = (undefined2)(uVar19 >> 0x10);
  auVar84._4_8_ = auVar195._8_8_;
  auVar84._2_2_ = uVar212;
  auVar84._0_2_ = uVar212;
  fVar412 = (float)(auVar84._0_4_ >> 0x10);
  fVar413 = (float)(auVar195._8_4_ >> 0x10);
  uVar127 = *(ulong *)(prim + uVar127 * 0x23 + 6);
  uVar212 = (undefined2)(uVar127 >> 0x30);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar127;
  auVar200._12_2_ = uVar212;
  auVar200._14_2_ = uVar212;
  uVar212 = (undefined2)(uVar127 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar127;
  auVar199._10_2_ = uVar212;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar212;
  auVar198._0_8_ = uVar127;
  uVar212 = (undefined2)(uVar127 >> 0x10);
  auVar85._4_8_ = auVar198._8_8_;
  auVar85._2_2_ = uVar212;
  auVar85._0_2_ = uVar212;
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar333._0_8_ =
       CONCAT44(((((float)(auVar228._4_4_ >> 0x10) - fVar213) * fVar426 + fVar213) - fVar434) *
                fVar356,((((float)(int)(short)local_528._0_2_ - auVar182._0_4_) * fVar426 +
                         auVar182._0_4_) - fVar364) * fVar401);
  auVar333._8_4_ =
       ((((float)(auVar229._8_4_ >> 0x10) - auVar154._8_4_) * fVar426 + auVar154._8_4_) - fVar372) *
       fVar414;
  auVar333._12_4_ =
       ((((float)(auVar230._12_4_ >> 0x10) - (float)(auVar180._12_4_ >> 0x10)) * fVar426 +
        (float)(auVar180._12_4_ >> 0x10)) - fVar375) * fVar360;
  fVar401 = ((((float)(int)(short)uVar136 - (float)(int)(short)uVar13) * fVar426 +
             (float)(int)(short)uVar13) - fVar364) * fVar401;
  fVar356 = ((((float)(auVar77._0_4_ >> 0x10) - fVar218) * fVar426 + fVar218) - fVar434) * fVar356;
  fVar414 = ((((float)(auVar232._8_4_ >> 0x10) - fVar331) * fVar426 + fVar331) - fVar372) * fVar414;
  fVar360 = ((((float)(auVar233._12_4_ >> 0x10) - (float)(auVar184._12_4_ >> 0x10)) * fVar426 +
             (float)(auVar184._12_4_ >> 0x10)) - fVar375) * fVar360;
  auVar382._0_8_ =
       CONCAT44(((((float)(auVar79._0_4_ >> 0x10) - fVar221) * fVar426 + fVar221) - fVar379) *
                fVar146,((((float)(int)(short)uVar14 - (float)(int)(short)uVar131) * fVar426 +
                         (float)(int)(short)uVar131) - fVar378) * fVar423);
  auVar382._8_4_ =
       ((((float)(auVar235._8_4_ >> 0x10) - fVar341) * fVar426 + fVar341) - fVar380) * fVar270;
  auVar382._12_4_ =
       ((((float)(auVar236._12_4_ >> 0x10) - (float)(auVar187._12_4_ >> 0x10)) * fVar426 +
        (float)(auVar187._12_4_ >> 0x10)) - fVar381) * fVar346;
  aVar389._0_4_ =
       ((((float)(int)(short)uVar16 - (float)(int)(short)uVar15) * fVar426 +
        (float)(int)(short)uVar15) - fVar378) * fVar423;
  aVar389._4_4_ =
       ((((float)(auVar81._0_4_ >> 0x10) - fVar225) * fVar426 + fVar225) - fVar379) * fVar146;
  aVar389._8_4_ =
       ((((float)(auVar238._8_4_ >> 0x10) - fVar342) * fVar426 + fVar342) - fVar380) * fVar270;
  aVar389._12_4_ =
       ((((float)(auVar239._12_4_ >> 0x10) - (float)(auVar190._12_4_ >> 0x10)) * fVar426 +
        (float)(auVar190._12_4_ >> 0x10)) - fVar381) * fVar346;
  auVar395._0_8_ =
       CONCAT44(((((float)(auVar83._0_4_ >> 0x10) - fVar268) * fVar426 + fVar268) - fVar390) *
                fVar147,((((float)(int)(short)uVar18 - (float)(int)(short)uVar17) * fVar426 +
                         (float)(int)(short)uVar17) - fVar368) * fVar409);
  auVar395._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - fVar343) * fVar426 + fVar343) - fVar399) * fVar321;
  auVar395._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar193._12_4_ >> 0x10)) * fVar426 +
        (float)(auVar193._12_4_ >> 0x10)) - fVar421) * fVar355;
  auVar405._0_4_ =
       ((((float)(int)(short)uVar127 - (float)(int)(short)uVar19) * fVar426 +
        (float)(int)(short)uVar19) - fVar368) * fVar409;
  auVar405._4_4_ =
       ((((float)(auVar85._0_4_ >> 0x10) - fVar412) * fVar426 + fVar412) - fVar390) * fVar147;
  auVar405._8_4_ =
       ((((float)(auVar198._8_4_ >> 0x10) - fVar413) * fVar426 + fVar413) - fVar399) * fVar321;
  auVar405._12_4_ =
       ((((float)(auVar199._12_4_ >> 0x10) - (float)(auVar196._12_4_ >> 0x10)) * fVar426 +
        (float)(auVar196._12_4_ >> 0x10)) - fVar421) * fVar355;
  auVar310._8_4_ = auVar333._8_4_;
  auVar310._0_8_ = auVar333._0_8_;
  auVar310._12_4_ = auVar333._12_4_;
  auVar177._4_4_ = fVar356;
  auVar177._0_4_ = fVar401;
  auVar177._8_4_ = fVar414;
  auVar177._12_4_ = fVar360;
  auVar227 = minps(auVar310,auVar177);
  auVar294._8_4_ = auVar382._8_4_;
  auVar294._0_8_ = auVar382._0_8_;
  auVar294._12_4_ = auVar382._12_4_;
  auVar177 = minps(auVar294,(undefined1  [16])aVar389);
  auVar227 = maxps(auVar227,auVar177);
  auVar295._8_4_ = auVar395._8_4_;
  auVar295._0_8_ = auVar395._0_8_;
  auVar295._12_4_ = auVar395._12_4_;
  auVar177 = minps(auVar295,auVar405);
  auVar244._4_4_ = uVar135;
  auVar244._0_4_ = uVar135;
  auVar244._8_4_ = uVar135;
  auVar244._12_4_ = uVar135;
  auVar177 = maxps(auVar177,auVar244);
  auVar177 = maxps(auVar227,auVar177);
  local_48 = auVar177._0_4_ * 0.99999964;
  fStack_44 = auVar177._4_4_ * 0.99999964;
  fStack_40 = auVar177._8_4_ * 0.99999964;
  fStack_3c = auVar177._12_4_ * 0.99999964;
  auVar227._4_4_ = fVar356;
  auVar227._0_4_ = fVar401;
  auVar227._8_4_ = fVar414;
  auVar227._12_4_ = fVar360;
  auVar177 = maxps(auVar333,auVar227);
  auVar227 = maxps(auVar382,(undefined1  [16])aVar389);
  auVar177 = minps(auVar177,auVar227);
  auVar227 = maxps(auVar395,auVar405);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar245._4_4_ = uVar135;
  auVar245._0_4_ = uVar135;
  auVar245._8_4_ = uVar135;
  auVar245._12_4_ = uVar135;
  aVar396 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)minps(auVar227,auVar245);
  auVar177 = minps(auVar177,(undefined1  [16])aVar396);
  auVar246._0_4_ = -(uint)(PVar20 != (Primitive)0x0 && local_48 <= auVar177._0_4_ * 1.0000004);
  auVar246._4_4_ = -(uint)(1 < (byte)PVar20 && fStack_44 <= auVar177._4_4_ * 1.0000004);
  auVar246._8_4_ = -(uint)(2 < (byte)PVar20 && fStack_40 <= auVar177._8_4_ * 1.0000004);
  auVar246._12_4_ = -(uint)(3 < (byte)PVar20 && fStack_3c <= auVar177._12_4_ * 1.0000004);
  uVar135 = movmskps((int)ray,auVar246);
  uVar136 = CONCAT44((int)((ulong)ray >> 0x20),uVar135);
  local_3d8 = mm_lookupmask_ps._0_8_;
  uStack_3d0 = mm_lookupmask_ps._8_8_;
  do {
    if (uVar136 == 0) {
      return;
    }
    lVar132 = 0;
    if (uVar136 != 0) {
      for (; (uVar136 >> lVar132 & 1) == 0; lVar132 = lVar132 + 1) {
      }
    }
    uStack_2b0._0_4_ = *(uint *)(prim + 2);
    pRVar130 = (RTCIntersectArguments *)(ulong)(uint)uStack_2b0;
    uVar139 = *(uint *)(prim + lVar132 * 4 + 6);
    pGVar26 = (context->scene->geometries).items[(long)pRVar130].ptr;
    uVar131 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                              (ulong)uVar139 *
                              pGVar26[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar423 = pGVar26->fnumTimeSegments;
    fVar146 = (pGVar26->time_range).lower;
    fVar147 = ((*(float *)(ray + k * 4 + 0x70) - fVar146) / ((pGVar26->time_range).upper - fVar146))
              * fVar423;
    fVar146 = floorf(fVar147);
    fVar423 = fVar423 + -1.0;
    if (fVar423 <= fVar146) {
      fVar146 = fVar423;
    }
    fVar423 = 0.0;
    if (0.0 <= fVar146) {
      fVar423 = fVar146;
    }
    _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar137 = (long)(int)fVar423 * 0x38;
    lVar132 = *(long *)(_Var27 + lVar137);
    lVar138 = *(long *)(_Var27 + 0x10 + lVar137);
    pGVar134 = *(Geometry **)(_Var27 + 0x38 + lVar137);
    lVar137 = *(long *)(_Var27 + 0x48 + lVar137);
    pRVar133 = (RTCIntersectArguments *)(lVar138 * (uVar131 + 3));
    ppp_Var1 = (_func_int ***)((long)&(pGVar134->super_RefCount)._vptr_RefCount + uVar131 * lVar137)
    ;
    pfVar2 = (float *)(lVar132 + lVar138 * uVar131);
    ppp_Var3 = (_func_int ***)
               ((long)&(pGVar134->super_RefCount)._vptr_RefCount + (uVar131 + 1) * lVar137);
    pfVar4 = (float *)(lVar132 + lVar138 * (uVar131 + 1));
    ppp_Var5 = (_func_int ***)
               ((long)&(pGVar134->super_RefCount)._vptr_RefCount + (uVar131 + 2) * lVar137);
    pfVar6 = (float *)(lVar132 + lVar138 * (uVar131 + 2));
    fVar147 = fVar147 - fVar423;
    fVar423 = 1.0 - fVar147;
    local_398 = *pfVar2 * fVar423 + *(float *)ppp_Var1 * fVar147;
    fStack_394 = pfVar2[1] * fVar423 + *(float *)((long)ppp_Var1 + 4) * fVar147;
    fStack_390 = pfVar2[2] * fVar423 +
                 *(float *)&(((atomic<unsigned_long> *)(ppp_Var1 + 1))->
                            super___atomic_base<unsigned_long>)._M_i * fVar147;
    fVar401 = pfVar2[3] * fVar423 + *(float *)((long)ppp_Var1 + 0xc) * fVar147;
    local_3a8 = *pfVar4 * fVar423 + *(float *)ppp_Var3 * fVar147;
    fStack_3a4 = pfVar4[1] * fVar423 + *(float *)((long)ppp_Var3 + 4) * fVar147;
    fStack_3a0 = pfVar4[2] * fVar423 +
                 *(float *)&(((atomic<unsigned_long> *)(ppp_Var3 + 1))->
                            super___atomic_base<unsigned_long>)._M_i * fVar147;
    fVar434 = pfVar4[3] * fVar423 + *(float *)((long)ppp_Var3 + 0xc) * fVar147;
    local_3b8 = *pfVar6 * fVar423 + *(float *)ppp_Var5 * fVar147;
    fStack_3b4 = pfVar6[1] * fVar423 + *(float *)((long)ppp_Var5 + 4) * fVar147;
    fStack_3b0 = pfVar6[2] * fVar423 +
                 *(float *)&(((atomic<unsigned_long> *)(ppp_Var5 + 1))->
                            super___atomic_base<unsigned_long>)._M_i * fVar147;
    fVar364 = pfVar6[3] * fVar423 + *(float *)((long)ppp_Var5 + 0xc) * fVar147;
    ppp_Var1 = (_func_int ***)
               ((long)&(pGVar134->super_RefCount)._vptr_RefCount + lVar137 * (uVar131 + 3));
    pfVar2 = (float *)((long)&pRVar133->flags + lVar132);
    local_3c8 = fVar423 * *pfVar2 + fVar147 * *(float *)ppp_Var1;
    fStack_3c4 = fVar423 * pfVar2[1] + fVar147 * *(float *)((long)ppp_Var1 + 4);
    fStack_3c0 = fVar423 * pfVar2[2] +
                 fVar147 * *(float *)&(((atomic<unsigned_long> *)(ppp_Var1 + 1))->
                                      super___atomic_base<unsigned_long>)._M_i;
    fVar409 = fVar423 * pfVar2[3] + fVar147 * *(float *)((long)ppp_Var1 + 0xc);
    iVar305 = (int)pGVar26[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar423 = *(float *)(ray + k * 4);
    fVar146 = *(float *)(ray + k * 4 + 0x10);
    fVar147 = *(float *)(ray + k * 4 + 0x20);
    fVar342 = local_398 - fVar423;
    fVar343 = fStack_394 - fVar146;
    fVar346 = fStack_390 - fVar147;
    fVar213 = pre->ray_space[k].vx.field_0.m128[0];
    fVar218 = pre->ray_space[k].vx.field_0.m128[1];
    fVar221 = pre->ray_space[k].vx.field_0.m128[2];
    fVar225 = pre->ray_space[k].vy.field_0.m128[0];
    fVar268 = pre->ray_space[k].vy.field_0.m128[1];
    fVar270 = pre->ray_space[k].vy.field_0.m128[2];
    fVar321 = pre->ray_space[k].vz.field_0.m128[0];
    fVar331 = pre->ray_space[k].vz.field_0.m128[1];
    fVar341 = pre->ray_space[k].vz.field_0.m128[2];
    fVar355 = fVar342 * fVar213 + fVar343 * fVar225 + fVar346 * fVar321;
    fVar414 = fVar342 * fVar218 + fVar343 * fVar268 + fVar346 * fVar331;
    fVar368 = fVar342 * fVar221 + fVar343 * fVar270 + fVar346 * fVar341;
    fVar342 = local_3a8 - fVar423;
    fVar343 = fStack_3a4 - fVar146;
    fVar346 = fStack_3a0 - fVar147;
    fVar356 = fVar342 * fVar213 + fVar343 * fVar225 + fVar346 * fVar321;
    fVar360 = fVar342 * fVar218 + fVar343 * fVar268 + fVar346 * fVar331;
    fVar390 = fVar342 * fVar221 + fVar343 * fVar270 + fVar346 * fVar341;
    fVar342 = local_3b8 - fVar423;
    fVar343 = fStack_3b4 - fVar146;
    fVar346 = fStack_3b0 - fVar147;
    fVar399 = fVar342 * fVar213 + fVar343 * fVar225 + fVar346 * fVar321;
    fVar421 = fVar342 * fVar218 + fVar343 * fVar268 + fVar346 * fVar331;
    fVar342 = fVar342 * fVar221 + fVar343 * fVar270 + fVar346 * fVar341;
    fVar423 = local_3c8 - fVar423;
    fVar146 = fStack_3c4 - fVar146;
    fVar147 = fStack_3c0 - fVar147;
    fVar213 = fVar423 * fVar213 + fVar146 * fVar225 + fVar147 * fVar321;
    fVar218 = fVar423 * fVar218 + fVar146 * fVar268 + fVar147 * fVar331;
    fVar146 = fVar423 * fVar221 + fVar146 * fVar270 + fVar147 * fVar341;
    auVar385._0_8_ = CONCAT44(fVar414,fVar355) & 0x7fffffff7fffffff;
    auVar385._8_4_ = ABS(fVar368);
    auVar385._12_4_ = ABS(fVar401);
    auVar334._0_8_ = CONCAT44(fVar360,fVar356) & 0x7fffffff7fffffff;
    auVar334._8_4_ = ABS(fVar390);
    auVar334._12_4_ = ABS(fVar434);
    auVar227 = maxps(auVar385,auVar334);
    auVar348._0_8_ = CONCAT44(fVar421,fVar399) & 0x7fffffff7fffffff;
    auVar348._8_4_ = ABS(fVar342);
    auVar348._12_4_ = ABS(fVar364);
    auVar247._0_8_ = CONCAT44(fVar218,fVar213) & 0x7fffffff7fffffff;
    auVar247._8_4_ = ABS(fVar146);
    auVar247._12_4_ = ABS(fVar409);
    auVar177 = maxps(auVar348,auVar247);
    auVar177 = maxps(auVar227,auVar177);
    uVar223 = auVar177._8_8_;
    fVar423 = auVar177._4_4_;
    if (auVar177._4_4_ <= auVar177._0_4_) {
      fVar423 = auVar177._0_4_;
    }
    auVar386._8_8_ = uVar223;
    auVar386._0_8_ = uVar223;
    fVar147 = (float)iVar305;
    if (auVar177._8_4_ <= fVar423) {
      auVar387._4_12_ = auVar386._4_12_;
      auVar387._0_4_ = fVar423;
      uVar223 = auVar387._0_8_;
    }
    lVar132 = (long)iVar305 * 0x44;
    fVar221 = *(float *)(catmullrom_basis0 + lVar132 + 0x908);
    fVar225 = *(float *)(catmullrom_basis0 + lVar132 + 0x90c);
    fVar268 = *(float *)(catmullrom_basis0 + lVar132 + 0x910);
    fVar270 = *(float *)(catmullrom_basis0 + lVar132 + 0x914);
    fVar423 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar132 + 0xd8c);
    fVar321 = *(float *)(catmullrom_basis0 + lVar132 + 0xd90);
    fVar331 = *(float *)(catmullrom_basis0 + lVar132 + 0xd94);
    auVar63 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar132 + 0xd8c);
    fVar341 = *(float *)(catmullrom_basis0 + lVar132 + 0xd98);
    fVar343 = *(float *)(catmullrom_basis0 + lVar132 + 0x484);
    fVar346 = *(float *)(catmullrom_basis0 + lVar132 + 0x488);
    fVar372 = *(float *)(catmullrom_basis0 + lVar132 + 0x48c);
    fVar375 = *(float *)(catmullrom_basis0 + lVar132 + 0x490);
    fVar378 = *(float *)(catmullrom_basis0 + lVar132);
    fVar379 = *(float *)(catmullrom_basis0 + lVar132 + 4);
    fVar380 = *(float *)(catmullrom_basis0 + lVar132 + 8);
    fVar381 = *(float *)(catmullrom_basis0 + lVar132 + 0xc);
    fVar307 = fVar355 * fVar378 + fVar356 * fVar343 + fVar399 * fVar221 + fVar213 * fVar423;
    fVar322 = fVar355 * fVar379 + fVar356 * fVar346 + fVar399 * fVar225 + fVar213 * fVar321;
    fVar325 = fVar355 * fVar380 + fVar356 * fVar372 + fVar399 * fVar268 + fVar213 * fVar331;
    fVar328 = fVar355 * fVar381 + fVar356 * fVar375 + fVar399 * fVar270 + fVar213 * fVar341;
    fVar430 = fVar414 * fVar378 + fVar360 * fVar343 + fVar421 * fVar221 + fVar218 * fVar423;
    fVar435 = fVar414 * fVar379 + fVar360 * fVar346 + fVar421 * fVar225 + fVar218 * fVar321;
    fVar438 = fVar414 * fVar380 + fVar360 * fVar372 + fVar421 * fVar268 + fVar218 * fVar331;
    fVar442 = fVar414 * fVar381 + fVar360 * fVar375 + fVar421 * fVar270 + fVar218 * fVar341;
    auVar406._0_4_ = fVar401 * fVar378 + fVar434 * fVar343 + fVar364 * fVar221 + fVar409 * fVar423;
    auVar406._4_4_ = fVar401 * fVar379 + fVar434 * fVar346 + fVar364 * fVar225 + fVar409 * fVar321;
    auVar406._8_4_ = fVar401 * fVar380 + fVar434 * fVar372 + fVar364 * fVar268 + fVar409 * fVar331;
    auVar406._12_4_ = fVar401 * fVar381 + fVar434 * fVar375 + fVar364 * fVar270 + fVar409 * fVar341;
    fVar423 = *(float *)*(undefined1 (*) [12])(catmullrom_basis1 + lVar132 + 0xd8c);
    fVar321 = *(float *)(catmullrom_basis1 + lVar132 + 0xd90);
    fVar331 = *(float *)(catmullrom_basis1 + lVar132 + 0xd94);
    auVar66 = *(undefined1 (*) [12])(catmullrom_basis1 + lVar132 + 0xd8c);
    fVar412 = *(float *)(catmullrom_basis1 + lVar132 + 0xd98);
    fVar413 = *(float *)(catmullrom_basis1 + lVar132 + 0x908);
    fVar415 = *(float *)(catmullrom_basis1 + lVar132 + 0x90c);
    fVar422 = *(float *)(catmullrom_basis1 + lVar132 + 0x910);
    fVar424 = *(float *)(catmullrom_basis1 + lVar132 + 0x914);
    fVar425 = *(float *)(catmullrom_basis1 + lVar132 + 0x484);
    fVar426 = *(float *)(catmullrom_basis1 + lVar132 + 0x488);
    fVar441 = *(float *)(catmullrom_basis1 + lVar132 + 0x48c);
    fVar445 = *(float *)(catmullrom_basis1 + lVar132 + 0x490);
    fVar367 = *(float *)(catmullrom_basis1 + lVar132);
    fVar402 = *(float *)(catmullrom_basis1 + lVar132 + 4);
    fVar371 = *(float *)(catmullrom_basis1 + lVar132 + 8);
    fVar410 = *(float *)(catmullrom_basis1 + lVar132 + 0xc);
    fVar365 = fVar355 * fVar367 + fVar356 * fVar425 + fVar399 * fVar413 + fVar213 * fVar423;
    fVar369 = fVar355 * fVar402 + fVar356 * fVar426 + fVar399 * fVar415 + fVar213 * fVar321;
    fVar373 = fVar355 * fVar371 + fVar356 * fVar441 + fVar399 * fVar422 + fVar213 * fVar331;
    fVar376 = fVar355 * fVar410 + fVar356 * fVar445 + fVar399 * fVar424 + fVar213 * fVar412;
    fVar148 = fVar414 * fVar367 + fVar360 * fVar425 + fVar421 * fVar413 + fVar218 * fVar423;
    fVar219 = fVar414 * fVar402 + fVar360 * fVar426 + fVar421 * fVar415 + fVar218 * fVar321;
    fVar222 = fVar414 * fVar371 + fVar360 * fVar441 + fVar421 * fVar422 + fVar218 * fVar331;
    fVar224 = fVar414 * fVar410 + fVar360 * fVar445 + fVar421 * fVar424 + fVar218 * fVar412;
    auVar349._0_4_ = fVar401 * fVar367 + fVar434 * fVar425 + fVar364 * fVar413 + fVar409 * fVar423;
    auVar349._4_4_ = fVar401 * fVar402 + fVar434 * fVar426 + fVar364 * fVar415 + fVar409 * fVar321;
    auVar349._8_4_ = fVar401 * fVar371 + fVar434 * fVar441 + fVar364 * fVar422 + fVar409 * fVar331;
    auVar349._12_4_ = fVar401 * fVar410 + fVar434 * fVar445 + fVar364 * fVar424 + fVar409 * fVar412;
    fVar357 = fVar365 - fVar307;
    fVar361 = fVar369 - fVar322;
    fVar362 = fVar373 - fVar325;
    fVar363 = fVar376 - fVar328;
    fVar321 = fVar148 - fVar430;
    fVar331 = fVar219 - fVar435;
    fVar344 = fVar222 - fVar438;
    fVar345 = fVar224 - fVar442;
    fVar423 = fVar430 * fVar357 - fVar307 * fVar321;
    fVar436 = fVar435 * fVar361 - fVar322 * fVar331;
    fVar439 = fVar438 * fVar362 - fVar325 * fVar344;
    fVar443 = fVar442 * fVar363 - fVar328 * fVar345;
    auVar177 = maxps(auVar406,auVar349);
    local_418 = (float)uVar223;
    bVar100 = fVar423 * fVar423 <=
              auVar177._0_4_ * auVar177._0_4_ * (fVar357 * fVar357 + fVar321 * fVar321) &&
              0.0 < fVar147;
    auVar432._0_4_ = -(uint)bVar100;
    bVar101 = fVar436 * fVar436 <=
              auVar177._4_4_ * auVar177._4_4_ * (fVar361 * fVar361 + fVar331 * fVar331) &&
              1.0 < fVar147;
    auVar432._4_4_ = -(uint)bVar101;
    bVar95 = fVar439 * fVar439 <=
             auVar177._8_4_ * auVar177._8_4_ * (fVar362 * fVar362 + fVar344 * fVar344) &&
             2.0 < fVar147;
    auVar432._8_4_ = -(uint)bVar95;
    bVar90 = 3.0 < fVar147 &&
             fVar443 * fVar443 <=
             auVar177._12_4_ * auVar177._12_4_ * (fVar363 * fVar363 + fVar345 * fVar345);
    auVar432._12_4_ = -(uint)bVar90;
    local_418 = local_418 * 4.7683716e-07;
    iVar214 = movmskps((int)(pre->ray_space + k),auVar432);
    fVar423 = *(float *)(ray + k * 4 + 0x30);
    _local_388 = ZEXT416((uint)fVar423);
    local_3e0 = pRVar130;
    fStack_3bc = fVar409;
    fStack_3ac = fVar364;
    fStack_39c = fVar434;
    fStack_38c = fVar401;
    if (iVar214 != 0) {
      local_528._0_4_ = auVar66._0_4_;
      stack0xfffffffffffffadc = auVar66._4_4_;
      fStack_520 = auVar66._8_4_;
      fVar308 = (float)local_528._0_4_ * fVar146 + fVar413 * fVar342 + fVar425 * fVar390 +
                fVar367 * fVar368;
      fVar323 = stack0xfffffffffffffadc * fVar146 + fVar415 * fVar342 + fVar426 * fVar390 +
                fVar402 * fVar368;
      fVar326 = fStack_520 * fVar146 + fVar422 * fVar342 + fVar441 * fVar390 + fVar371 * fVar368;
      fVar329 = fVar412 * fVar146 + fVar424 * fVar342 + fVar445 * fVar390 + fVar410 * fVar368;
      local_318 = auVar63._0_4_;
      fStack_314 = auVar63._4_4_;
      fStack_310 = auVar63._8_4_;
      fVar309 = local_318 * fVar146 + fVar221 * fVar342 + fVar343 * fVar390 + fVar378 * fVar368;
      fVar324 = fStack_314 * fVar146 + fVar225 * fVar342 + fVar346 * fVar390 + fVar379 * fVar368;
      fVar327 = fStack_310 * fVar146 + fVar268 * fVar342 + fVar372 * fVar390 + fVar380 * fVar368;
      fVar330 = fVar341 * fVar146 + fVar270 * fVar342 + fVar375 * fVar390 + fVar381 * fVar368;
      fVar221 = *(float *)(catmullrom_basis0 + lVar132 + 0x1210);
      fVar225 = *(float *)(catmullrom_basis0 + lVar132 + 0x1214);
      fVar268 = *(float *)(catmullrom_basis0 + lVar132 + 0x1218);
      fVar270 = *(float *)(catmullrom_basis0 + lVar132 + 0x121c);
      fVar341 = *(float *)(catmullrom_basis0 + lVar132 + 0x1694);
      fVar343 = *(float *)(catmullrom_basis0 + lVar132 + 0x1698);
      fVar346 = *(float *)(catmullrom_basis0 + lVar132 + 0x169c);
      fVar372 = *(float *)(catmullrom_basis0 + lVar132 + 0x16a0);
      fVar375 = *(float *)(catmullrom_basis0 + lVar132 + 0x1b18);
      fVar378 = *(float *)(catmullrom_basis0 + lVar132 + 0x1b1c);
      fVar379 = *(float *)(catmullrom_basis0 + lVar132 + 0x1b20);
      fVar380 = *(float *)(catmullrom_basis0 + lVar132 + 0x1b24);
      fVar381 = *(float *)(catmullrom_basis0 + lVar132 + 0x1f9c);
      fVar412 = *(float *)(catmullrom_basis0 + lVar132 + 0x1fa0);
      fVar413 = *(float *)(catmullrom_basis0 + lVar132 + 0x1fa4);
      fVar415 = *(float *)(catmullrom_basis0 + lVar132 + 0x1fa8);
      fVar384 = fVar355 * fVar221 + fVar356 * fVar341 + fVar399 * fVar375 + fVar213 * fVar381;
      fVar391 = fVar355 * fVar225 + fVar356 * fVar343 + fVar399 * fVar378 + fVar213 * fVar412;
      fVar392 = fVar355 * fVar268 + fVar356 * fVar346 + fVar399 * fVar379 + fVar213 * fVar413;
      fVar393 = fVar355 * fVar270 + fVar356 * fVar372 + fVar399 * fVar380 + fVar213 * fVar415;
      fVar431 = fVar414 * fVar221 + fVar360 * fVar341 + fVar421 * fVar375 + fVar218 * fVar381;
      fVar437 = fVar414 * fVar225 + fVar360 * fVar343 + fVar421 * fVar378 + fVar218 * fVar412;
      fVar440 = fVar414 * fVar268 + fVar360 * fVar346 + fVar421 * fVar379 + fVar218 * fVar413;
      fVar444 = fVar414 * fVar270 + fVar360 * fVar372 + fVar421 * fVar380 + fVar218 * fVar415;
      fVar422 = *(float *)(catmullrom_basis1 + lVar132 + 0x1210);
      fVar424 = *(float *)(catmullrom_basis1 + lVar132 + 0x1214);
      fVar425 = *(float *)(catmullrom_basis1 + lVar132 + 0x1218);
      fVar426 = *(float *)(catmullrom_basis1 + lVar132 + 0x121c);
      fVar441 = *(float *)(catmullrom_basis1 + lVar132 + 0x1b18);
      fVar445 = *(float *)(catmullrom_basis1 + lVar132 + 0x1b1c);
      fVar367 = *(float *)(catmullrom_basis1 + lVar132 + 0x1b20);
      fVar402 = *(float *)(catmullrom_basis1 + lVar132 + 0x1b24);
      fVar371 = *(float *)(catmullrom_basis1 + lVar132 + 0x1f9c);
      fVar410 = *(float *)(catmullrom_basis1 + lVar132 + 0x1fa0);
      fVar436 = *(float *)(catmullrom_basis1 + lVar132 + 0x1fa4);
      fVar439 = *(float *)(catmullrom_basis1 + lVar132 + 0x1fa8);
      fVar443 = *(float *)(catmullrom_basis1 + lVar132 + 0x1694);
      fVar400 = *(float *)(catmullrom_basis1 + lVar132 + 0x1698);
      fVar403 = *(float *)(catmullrom_basis1 + lVar132 + 0x169c);
      fVar411 = *(float *)(catmullrom_basis1 + lVar132 + 0x16a0);
      fVar366 = fVar355 * fVar422 + fVar356 * fVar443 + fVar399 * fVar441 + fVar213 * fVar371;
      fVar370 = fVar355 * fVar424 + fVar356 * fVar400 + fVar399 * fVar445 + fVar213 * fVar410;
      fVar374 = fVar355 * fVar425 + fVar356 * fVar403 + fVar399 * fVar367 + fVar213 * fVar436;
      fVar377 = fVar355 * fVar426 + fVar356 * fVar411 + fVar399 * fVar402 + fVar213 * fVar439;
      fVar226 = fVar414 * fVar422 + fVar360 * fVar443 + fVar421 * fVar441 + fVar218 * fVar371;
      fVar269 = fVar414 * fVar424 + fVar360 * fVar400 + fVar421 * fVar445 + fVar218 * fVar410;
      fVar271 = fVar414 * fVar425 + fVar360 * fVar403 + fVar421 * fVar367 + fVar218 * fVar436;
      fVar272 = fVar414 * fVar426 + fVar360 * fVar411 + fVar421 * fVar402 + fVar218 * fVar439;
      auVar407._0_8_ = CONCAT44(fVar391,fVar384) & 0x7fffffff7fffffff;
      auVar407._8_4_ = ABS(fVar392);
      auVar407._12_4_ = ABS(fVar393);
      auVar28._8_4_ = ABS(fVar440);
      auVar28._0_8_ = CONCAT44(fVar437,fVar431) & 0x7fffffff7fffffff;
      auVar28._12_4_ = ABS(fVar444);
      auVar177 = maxps(auVar407,auVar28);
      auVar417._0_8_ =
           CONCAT44(fVar225 * fVar368 + fVar343 * fVar390 + fVar378 * fVar342 + fVar412 * fVar146,
                    fVar221 * fVar368 + fVar341 * fVar390 + fVar375 * fVar342 + fVar381 * fVar146) &
           0x7fffffff7fffffff;
      auVar417._8_4_ =
           ABS(fVar268 * fVar368 + fVar346 * fVar390 + fVar379 * fVar342 + fVar413 * fVar146);
      auVar417._12_4_ =
           ABS(fVar270 * fVar368 + fVar372 * fVar390 + fVar380 * fVar342 + fVar415 * fVar146);
      auVar177 = maxps(auVar177,auVar417);
      uVar140 = -(uint)(local_418 <= auVar177._0_4_);
      uVar141 = -(uint)(local_418 <= auVar177._4_4_);
      uVar142 = -(uint)(local_418 <= auVar177._8_4_);
      uVar143 = -(uint)(local_418 <= auVar177._12_4_);
      fVar346 = (float)((uint)fVar384 & uVar140 | ~uVar140 & (uint)fVar357);
      fVar372 = (float)((uint)fVar391 & uVar141 | ~uVar141 & (uint)fVar361);
      fVar375 = (float)((uint)fVar392 & uVar142 | ~uVar142 & (uint)fVar362);
      fVar378 = (float)((uint)fVar393 & uVar143 | ~uVar143 & (uint)fVar363);
      auVar61._4_4_ = fVar331;
      auVar61._0_4_ = fVar321;
      auVar61._8_4_ = fVar344;
      auVar61._12_4_ = fVar345;
      fVar381 = (float)(~uVar140 & (uint)fVar321 | (uint)fVar431 & uVar140);
      fVar412 = (float)(~uVar141 & (uint)fVar331 | (uint)fVar437 & uVar141);
      fVar413 = (float)(~uVar142 & (uint)fVar344 | (uint)fVar440 & uVar142);
      fVar415 = (float)(~uVar143 & (uint)fVar345 | (uint)fVar444 & uVar143);
      auVar418._0_8_ = CONCAT44(fVar370,fVar366) & 0x7fffffff7fffffff;
      auVar418._8_4_ = ABS(fVar374);
      auVar418._12_4_ = ABS(fVar377);
      auVar383._0_8_ = CONCAT44(fVar269,fVar226) & 0x7fffffff7fffffff;
      auVar383._8_4_ = ABS(fVar271);
      auVar383._12_4_ = ABS(fVar272);
      auVar177 = maxps(auVar418,auVar383);
      auVar358._0_8_ =
           CONCAT44(fVar424 * fVar368 + fVar400 * fVar390 + fVar445 * fVar342 + fVar410 * fVar146,
                    fVar422 * fVar368 + fVar443 * fVar390 + fVar441 * fVar342 + fVar371 * fVar146) &
           0x7fffffff7fffffff;
      auVar358._8_4_ =
           ABS(fVar425 * fVar368 + fVar403 * fVar390 + fVar367 * fVar342 + fVar436 * fVar146);
      auVar358._12_4_ =
           ABS(fVar426 * fVar368 + fVar411 * fVar390 + fVar402 * fVar342 + fVar439 * fVar146);
      auVar177 = maxps(auVar177,auVar358);
      uVar140 = -(uint)(local_418 <= auVar177._0_4_);
      uVar141 = -(uint)(local_418 <= auVar177._4_4_);
      uVar142 = -(uint)(local_418 <= auVar177._8_4_);
      uVar143 = -(uint)(local_418 <= auVar177._12_4_);
      fVar341 = (float)((uint)fVar366 & uVar140 | ~uVar140 & (uint)fVar357);
      fVar343 = (float)((uint)fVar370 & uVar141 | ~uVar141 & (uint)fVar361);
      fVar379 = (float)((uint)fVar374 & uVar142 | ~uVar142 & (uint)fVar362);
      fVar380 = (float)((uint)fVar377 & uVar143 | ~uVar143 & (uint)fVar363);
      fVar321 = (float)(~uVar140 & (uint)fVar321 | (uint)fVar226 & uVar140);
      fVar331 = (float)(~uVar141 & (uint)fVar331 | (uint)fVar269 & uVar141);
      fVar422 = (float)(~uVar142 & (uint)fVar344 | (uint)fVar271 & uVar142);
      fVar424 = (float)(~uVar143 & (uint)fVar345 | (uint)fVar272 & uVar143);
      auVar248._0_4_ = fVar381 * fVar381 + fVar346 * fVar346;
      auVar248._4_4_ = fVar412 * fVar412 + fVar372 * fVar372;
      auVar248._8_4_ = fVar413 * fVar413 + fVar375 * fVar375;
      auVar248._12_4_ = fVar415 * fVar415 + fVar378 * fVar378;
      auVar177 = rsqrtps(auVar61,auVar248);
      fVar221 = auVar177._0_4_;
      fVar225 = auVar177._4_4_;
      fVar268 = auVar177._8_4_;
      fVar270 = auVar177._12_4_;
      auVar335._0_4_ = fVar221 * fVar221 * auVar248._0_4_ * 0.5 * fVar221;
      auVar335._4_4_ = fVar225 * fVar225 * auVar248._4_4_ * 0.5 * fVar225;
      auVar335._8_4_ = fVar268 * fVar268 * auVar248._8_4_ * 0.5 * fVar268;
      auVar335._12_4_ = fVar270 * fVar270 * auVar248._12_4_ * 0.5 * fVar270;
      fVar425 = fVar221 * 1.5 - auVar335._0_4_;
      fVar426 = fVar225 * 1.5 - auVar335._4_4_;
      fVar441 = fVar268 * 1.5 - auVar335._8_4_;
      fVar445 = fVar270 * 1.5 - auVar335._12_4_;
      auVar249._0_4_ = fVar321 * fVar321 + fVar341 * fVar341;
      auVar249._4_4_ = fVar331 * fVar331 + fVar343 * fVar343;
      auVar249._8_4_ = fVar422 * fVar422 + fVar379 * fVar379;
      auVar249._12_4_ = fVar424 * fVar424 + fVar380 * fVar380;
      auVar177 = rsqrtps(auVar335,auVar249);
      fVar221 = auVar177._0_4_;
      fVar225 = auVar177._4_4_;
      fVar268 = auVar177._8_4_;
      fVar270 = auVar177._12_4_;
      fVar221 = fVar221 * 1.5 - fVar221 * fVar221 * auVar249._0_4_ * 0.5 * fVar221;
      fVar225 = fVar225 * 1.5 - fVar225 * fVar225 * auVar249._4_4_ * 0.5 * fVar225;
      fVar268 = fVar268 * 1.5 - fVar268 * fVar268 * auVar249._8_4_ * 0.5 * fVar268;
      fVar270 = fVar270 * 1.5 - fVar270 * fVar270 * auVar249._12_4_ * 0.5 * fVar270;
      fVar402 = fVar381 * fVar425 * auVar406._0_4_;
      fVar410 = fVar412 * fVar426 * auVar406._4_4_;
      fVar226 = fVar413 * fVar441 * auVar406._8_4_;
      fVar271 = fVar415 * fVar445 * auVar406._12_4_;
      fVar346 = -fVar346 * fVar425 * auVar406._0_4_;
      fVar372 = -fVar372 * fVar426 * auVar406._4_4_;
      fVar375 = -fVar375 * fVar441 * auVar406._8_4_;
      fVar378 = -fVar378 * fVar445 * auVar406._12_4_;
      fVar384 = fVar425 * 0.0 * auVar406._0_4_;
      fVar391 = fVar426 * 0.0 * auVar406._4_4_;
      fVar392 = fVar441 * 0.0 * auVar406._8_4_;
      fVar393 = fVar445 * 0.0 * auVar406._12_4_;
      fVar366 = fVar321 * fVar221 * auVar349._0_4_;
      fVar370 = fVar331 * fVar225 * auVar349._4_4_;
      fVar374 = fVar422 * fVar268 * auVar349._8_4_;
      fVar377 = fVar424 * fVar270 * auVar349._12_4_;
      fVar357 = fVar365 + fVar366;
      fVar361 = fVar369 + fVar370;
      fVar362 = fVar373 + fVar374;
      fVar363 = fVar376 + fVar377;
      fVar425 = -fVar341 * fVar221 * auVar349._0_4_;
      fVar426 = -fVar343 * fVar225 * auVar349._4_4_;
      fVar441 = -fVar379 * fVar268 * auVar349._8_4_;
      fVar445 = -fVar380 * fVar270 * auVar349._12_4_;
      fVar436 = fVar148 + fVar425;
      fVar439 = fVar219 + fVar426;
      fVar443 = fVar222 + fVar441;
      fVar400 = fVar224 + fVar445;
      fVar380 = fVar221 * 0.0 * auVar349._0_4_;
      fVar412 = fVar225 * 0.0 * auVar349._4_4_;
      fVar415 = fVar268 * 0.0 * auVar349._8_4_;
      fVar424 = fVar270 * 0.0 * auVar349._12_4_;
      fVar367 = fVar307 - fVar402;
      fVar371 = fVar322 - fVar410;
      fVar344 = fVar325 - fVar226;
      fVar345 = fVar328 - fVar271;
      fVar403 = fVar308 + fVar380;
      fVar411 = fVar323 + fVar412;
      fVar269 = fVar326 + fVar415;
      fVar272 = fVar329 + fVar424;
      fVar321 = fVar430 - fVar346;
      fVar331 = fVar435 - fVar372;
      fVar341 = fVar438 - fVar375;
      fVar343 = fVar442 - fVar378;
      fVar379 = fVar309 - fVar384;
      fVar381 = fVar324 - fVar391;
      fVar413 = fVar327 - fVar392;
      fVar422 = fVar330 - fVar393;
      uVar140 = -(uint)(0.0 < (fVar321 * (fVar403 - fVar379) - fVar379 * (fVar436 - fVar321)) * 0.0
                              + (fVar379 * (fVar357 - fVar367) - (fVar403 - fVar379) * fVar367) *
                                0.0 + ((fVar436 - fVar321) * fVar367 - (fVar357 - fVar367) * fVar321
                                      ));
      uVar141 = -(uint)(0.0 < (fVar331 * (fVar411 - fVar381) - fVar381 * (fVar439 - fVar331)) * 0.0
                              + (fVar381 * (fVar361 - fVar371) - (fVar411 - fVar381) * fVar371) *
                                0.0 + ((fVar439 - fVar331) * fVar371 - (fVar361 - fVar371) * fVar331
                                      ));
      uVar142 = -(uint)(0.0 < (fVar341 * (fVar269 - fVar413) - fVar413 * (fVar443 - fVar341)) * 0.0
                              + (fVar413 * (fVar362 - fVar344) - (fVar269 - fVar413) * fVar344) *
                                0.0 + ((fVar443 - fVar341) * fVar344 - (fVar362 - fVar344) * fVar341
                                      ));
      uVar143 = -(uint)(0.0 < (fVar343 * (fVar272 - fVar422) - fVar422 * (fVar400 - fVar343)) * 0.0
                              + (fVar422 * (fVar363 - fVar345) - (fVar272 - fVar422) * fVar345) *
                                0.0 + ((fVar400 - fVar343) * fVar345 - (fVar363 - fVar345) * fVar343
                                      ));
      fVar221 = (float)((uint)(fVar365 - fVar366) & uVar140 | ~uVar140 & (uint)(fVar307 + fVar402));
      fVar225 = (float)((uint)(fVar369 - fVar370) & uVar141 | ~uVar141 & (uint)(fVar322 + fVar410));
      fVar268 = (float)((uint)(fVar373 - fVar374) & uVar142 | ~uVar142 & (uint)(fVar325 + fVar226));
      fVar270 = (float)((uint)(fVar376 - fVar377) & uVar143 | ~uVar143 & (uint)(fVar328 + fVar271));
      fVar425 = (float)((uint)(fVar148 - fVar425) & uVar140 | ~uVar140 & (uint)(fVar430 + fVar346));
      fVar426 = (float)((uint)(fVar219 - fVar426) & uVar141 | ~uVar141 & (uint)(fVar435 + fVar372));
      fVar441 = (float)((uint)(fVar222 - fVar441) & uVar142 | ~uVar142 & (uint)(fVar438 + fVar375));
      fVar445 = (float)((uint)(fVar224 - fVar445) & uVar143 | ~uVar143 & (uint)(fVar442 + fVar378));
      fVar373 = (float)((uint)(fVar308 - fVar380) & uVar140 | ~uVar140 & (uint)(fVar309 + fVar384));
      fVar376 = (float)((uint)(fVar323 - fVar412) & uVar141 | ~uVar141 & (uint)(fVar324 + fVar391));
      fVar430 = (float)((uint)(fVar326 - fVar415) & uVar142 | ~uVar142 & (uint)(fVar327 + fVar392));
      fVar435 = (float)((uint)(fVar329 - fVar424) & uVar143 | ~uVar143 & (uint)(fVar330 + fVar393));
      fVar402 = (float)((uint)fVar367 & uVar140 | ~uVar140 & (uint)fVar357);
      fVar410 = (float)((uint)fVar371 & uVar141 | ~uVar141 & (uint)fVar361);
      fVar148 = (float)((uint)fVar344 & uVar142 | ~uVar142 & (uint)fVar362);
      fVar219 = (float)((uint)fVar345 & uVar143 | ~uVar143 & (uint)fVar363);
      fVar346 = (float)((uint)fVar321 & uVar140 | ~uVar140 & (uint)fVar436);
      fVar372 = (float)((uint)fVar331 & uVar141 | ~uVar141 & (uint)fVar439);
      fVar375 = (float)((uint)fVar341 & uVar142 | ~uVar142 & (uint)fVar443);
      fVar378 = (float)((uint)fVar343 & uVar143 | ~uVar143 & (uint)fVar400);
      fVar380 = (float)((uint)fVar379 & uVar140 | ~uVar140 & (uint)fVar403);
      fVar412 = (float)((uint)fVar381 & uVar141 | ~uVar141 & (uint)fVar411);
      fVar415 = (float)((uint)fVar413 & uVar142 | ~uVar142 & (uint)fVar269);
      fVar424 = (float)((uint)fVar422 & uVar143 | ~uVar143 & (uint)fVar272);
      fVar367 = (float)((uint)fVar357 & uVar140 | ~uVar140 & (uint)fVar367) - fVar221;
      fVar371 = (float)((uint)fVar361 & uVar141 | ~uVar141 & (uint)fVar371) - fVar225;
      fVar222 = (float)((uint)fVar362 & uVar142 | ~uVar142 & (uint)fVar344) - fVar268;
      fVar224 = (float)((uint)fVar363 & uVar143 | ~uVar143 & (uint)fVar345) - fVar270;
      fVar307 = (float)((uint)fVar436 & uVar140 | ~uVar140 & (uint)fVar321) - fVar425;
      fVar322 = (float)((uint)fVar439 & uVar141 | ~uVar141 & (uint)fVar331) - fVar426;
      fVar325 = (float)((uint)fVar443 & uVar142 | ~uVar142 & (uint)fVar341) - fVar441;
      fVar328 = (float)((uint)fVar400 & uVar143 | ~uVar143 & (uint)fVar343) - fVar445;
      fVar344 = (float)((uint)fVar403 & uVar140 | ~uVar140 & (uint)fVar379) - fVar373;
      fVar345 = (float)((uint)fVar411 & uVar141 | ~uVar141 & (uint)fVar381) - fVar376;
      fVar357 = (float)((uint)fVar269 & uVar142 | ~uVar142 & (uint)fVar413) - fVar430;
      fVar361 = (float)((uint)fVar272 & uVar143 | ~uVar143 & (uint)fVar422) - fVar435;
      fVar436 = fVar221 - fVar402;
      fVar438 = fVar225 - fVar410;
      fVar439 = fVar268 - fVar148;
      fVar442 = fVar270 - fVar219;
      fVar379 = fVar425 - fVar346;
      fVar381 = fVar426 - fVar372;
      fVar413 = fVar441 - fVar375;
      fVar422 = fVar445 - fVar378;
      fVar321 = fVar373 - fVar380;
      fVar331 = fVar376 - fVar412;
      fVar341 = fVar430 - fVar415;
      fVar343 = fVar435 - fVar424;
      fVar362 = (fVar425 * fVar344 - fVar373 * fVar307) * 0.0 +
                (fVar373 * fVar367 - fVar221 * fVar344) * 0.0 +
                (fVar221 * fVar307 - fVar425 * fVar367);
      fVar363 = (fVar426 * fVar345 - fVar376 * fVar322) * 0.0 +
                (fVar376 * fVar371 - fVar225 * fVar345) * 0.0 +
                (fVar225 * fVar322 - fVar426 * fVar371);
      auVar311._4_4_ = fVar363;
      auVar311._0_4_ = fVar362;
      fVar365 = (fVar441 * fVar357 - fVar430 * fVar325) * 0.0 +
                (fVar430 * fVar222 - fVar268 * fVar357) * 0.0 +
                (fVar268 * fVar325 - fVar441 * fVar222);
      fVar369 = (fVar445 * fVar361 - fVar435 * fVar328) * 0.0 +
                (fVar435 * fVar224 - fVar270 * fVar361) * 0.0 +
                (fVar270 * fVar328 - fVar445 * fVar224);
      auVar427._0_4_ =
           (fVar346 * fVar321 - fVar380 * fVar379) * 0.0 +
           (fVar380 * fVar436 - fVar402 * fVar321) * 0.0 + (fVar402 * fVar379 - fVar346 * fVar436);
      auVar427._4_4_ =
           (fVar372 * fVar331 - fVar412 * fVar381) * 0.0 +
           (fVar412 * fVar438 - fVar410 * fVar331) * 0.0 + (fVar410 * fVar381 - fVar372 * fVar438);
      auVar427._8_4_ =
           (fVar375 * fVar341 - fVar415 * fVar413) * 0.0 +
           (fVar415 * fVar439 - fVar148 * fVar341) * 0.0 + (fVar148 * fVar413 - fVar375 * fVar439);
      auVar427._12_4_ =
           (fVar378 * fVar343 - fVar424 * fVar422) * 0.0 +
           (fVar424 * fVar442 - fVar219 * fVar343) * 0.0 + (fVar219 * fVar422 - fVar378 * fVar442);
      auVar311._8_4_ = fVar365;
      auVar311._12_4_ = fVar369;
      auVar177 = maxps(auVar311,auVar427);
      bVar100 = auVar177._0_4_ <= 0.0 && bVar100;
      auVar312._0_4_ = -(uint)bVar100;
      bVar101 = auVar177._4_4_ <= 0.0 && bVar101;
      auVar312._4_4_ = -(uint)bVar101;
      bVar95 = auVar177._8_4_ <= 0.0 && bVar95;
      auVar312._8_4_ = -(uint)bVar95;
      bVar90 = auVar177._12_4_ <= 0.0 && bVar90;
      auVar312._12_4_ = -(uint)bVar90;
      iVar214 = movmskps(iVar214,auVar312);
      if (iVar214 == 0) {
        auVar313._8_8_ = uStack_3d0;
        auVar313._0_8_ = local_3d8;
        iVar214 = 0;
      }
      else {
        auVar336._0_4_ = fVar321 * fVar307;
        auVar336._4_4_ = fVar331 * fVar322;
        auVar336._8_4_ = fVar341 * fVar325;
        auVar336._12_4_ = fVar343 * fVar328;
        fVar380 = fVar379 * fVar344 - auVar336._0_4_;
        fVar412 = fVar381 * fVar345 - auVar336._4_4_;
        fVar415 = fVar413 * fVar357 - auVar336._8_4_;
        fVar424 = fVar422 * fVar361 - auVar336._12_4_;
        fVar321 = fVar321 * fVar367 - fVar344 * fVar436;
        fVar346 = fVar331 * fVar371 - fVar345 * fVar438;
        fVar372 = fVar341 * fVar222 - fVar357 * fVar439;
        fVar375 = fVar343 * fVar224 - fVar361 * fVar442;
        fVar379 = fVar436 * fVar307 - fVar379 * fVar367;
        fVar381 = fVar438 * fVar322 - fVar381 * fVar371;
        fVar413 = fVar439 * fVar325 - fVar413 * fVar222;
        fVar422 = fVar442 * fVar328 - fVar422 * fVar224;
        auVar350._0_4_ = fVar380 * 0.0 + fVar321 * 0.0 + fVar379;
        auVar350._4_4_ = fVar412 * 0.0 + fVar346 * 0.0 + fVar381;
        auVar350._8_4_ = fVar415 * 0.0 + fVar372 * 0.0 + fVar413;
        auVar350._12_4_ = fVar424 * 0.0 + fVar375 * 0.0 + fVar422;
        auVar177 = rcpps(auVar336,auVar350);
        fVar331 = auVar177._0_4_;
        fVar341 = auVar177._4_4_;
        fVar343 = auVar177._8_4_;
        fVar378 = auVar177._12_4_;
        fVar331 = (1.0 - auVar350._0_4_ * fVar331) * fVar331 + fVar331;
        fVar341 = (1.0 - auVar350._4_4_ * fVar341) * fVar341 + fVar341;
        fVar343 = (1.0 - auVar350._8_4_ * fVar343) * fVar343 + fVar343;
        fVar378 = (1.0 - auVar350._12_4_ * fVar378) * fVar378 + fVar378;
        fVar321 = (fVar373 * fVar379 + fVar425 * fVar321 + fVar221 * fVar380) * fVar331;
        fVar225 = (fVar376 * fVar381 + fVar426 * fVar346 + fVar225 * fVar412) * fVar341;
        aVar397.v[1] = fVar225;
        aVar397.v[0] = fVar321;
        fVar268 = (fVar430 * fVar413 + fVar441 * fVar372 + fVar268 * fVar415) * fVar343;
        fVar270 = (fVar435 * fVar422 + fVar445 * fVar375 + fVar270 * fVar424) * fVar378;
        fVar221 = *(float *)(ray + k * 4 + 0x80);
        bVar100 = (fVar321 <= fVar221 && fVar423 <= fVar321) && bVar100;
        auVar201._0_4_ = -(uint)bVar100;
        bVar101 = (fVar225 <= fVar221 && fVar423 <= fVar225) && bVar101;
        auVar201._4_4_ = -(uint)bVar101;
        bVar95 = (fVar268 <= fVar221 && fVar423 <= fVar268) && bVar95;
        auVar201._8_4_ = -(uint)bVar95;
        bVar90 = (fVar270 <= fVar221 && fVar423 <= fVar270) && bVar90;
        auVar201._12_4_ = -(uint)bVar90;
        iVar214 = movmskps(iVar214,auVar201);
        if (iVar214 == 0) {
          auVar313._8_8_ = uStack_3d0;
          auVar313._0_8_ = local_3d8;
          iVar214 = 0;
        }
        else {
          auVar202._0_8_ =
               CONCAT44(-(uint)(auVar350._4_4_ != 0.0 && bVar101),
                        -(uint)(auVar350._0_4_ != 0.0 && bVar100));
          auVar202._8_4_ = -(uint)(auVar350._8_4_ != 0.0 && bVar95);
          auVar202._12_4_ = -(uint)(auVar350._12_4_ != 0.0 && bVar90);
          iVar214 = movmskps(iVar214,auVar202);
          auVar313._8_8_ = uStack_3d0;
          auVar313._0_8_ = local_3d8;
          if (iVar214 != 0) {
            fVar362 = fVar362 * fVar331;
            fVar363 = fVar363 * fVar341;
            fVar365 = fVar365 * fVar343;
            fVar369 = fVar369 * fVar378;
            auVar250._0_4_ = ~uVar140 & (uint)fVar362;
            auVar250._4_4_ = ~uVar141 & (uint)fVar363;
            auVar250._8_4_ = ~uVar142 & (uint)fVar365;
            auVar250._12_4_ = ~uVar143 & (uint)fVar369;
            auVar388._0_4_ = (uint)(1.0 - fVar362) & uVar140;
            auVar388._4_4_ = (uint)(1.0 - fVar363) & uVar141;
            auVar388._8_4_ = (uint)(1.0 - fVar365) & uVar142;
            auVar388._12_4_ = (uint)(1.0 - fVar369) & uVar143;
            aVar389 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar388 | auVar250);
            local_278 = (float)(~uVar140 & (uint)(auVar427._0_4_ * fVar331) |
                               (uint)(1.0 - auVar427._0_4_ * fVar331) & uVar140);
            fStack_274 = (float)(~uVar141 & (uint)(auVar427._4_4_ * fVar341) |
                                (uint)(1.0 - auVar427._4_4_ * fVar341) & uVar141);
            fStack_270 = (float)(~uVar142 & (uint)(auVar427._8_4_ * fVar343) |
                                (uint)(1.0 - auVar427._8_4_ * fVar343) & uVar142);
            fStack_26c = (float)(~uVar143 & (uint)(auVar427._12_4_ * fVar378) |
                                (uint)(1.0 - auVar427._12_4_ * fVar378) & uVar143);
            auVar313._8_4_ = auVar202._8_4_;
            auVar313._0_8_ = auVar202._0_8_;
            auVar313._12_4_ = auVar202._12_4_;
            aVar397.v[2] = fVar268;
            aVar397.v[3] = fVar270;
            aVar396 = aVar397;
          }
        }
      }
      iVar214 = movmskps(iVar214,auVar313);
      if (iVar214 != 0) {
        fVar221 = (auVar349._0_4_ - auVar406._0_4_) * aVar389.v[0] + auVar406._0_4_;
        fVar225 = (auVar349._4_4_ - auVar406._4_4_) * aVar389.v[1] + auVar406._4_4_;
        fVar268 = (auVar349._8_4_ - auVar406._8_4_) * aVar389.v[2] + auVar406._8_4_;
        fVar270 = (auVar349._12_4_ - auVar406._12_4_) * aVar389.v[3] + auVar406._12_4_;
        fVar423 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        fVar321 = aVar396.v[0];
        fVar331 = aVar396.v[1];
        fVar341 = aVar396.v[2];
        fVar343 = aVar396.v[3];
        aVar203._0_4_ = -(uint)(fVar423 * (fVar221 + fVar221) < fVar321) & auVar313._0_4_;
        aVar203._4_4_ = -(uint)(fVar423 * (fVar225 + fVar225) < fVar331) & auVar313._4_4_;
        aVar203._8_4_ = -(uint)(fVar423 * (fVar268 + fVar268) < fVar341) & auVar313._8_4_;
        aVar203._12_4_ = -(uint)(fVar423 * (fVar270 + fVar270) < fVar343) & auVar313._12_4_;
        iVar214 = movmskps((int)pre,(undefined1  [16])aVar203);
        if (iVar214 != 0) {
          local_278 = local_278 + local_278 + -1.0;
          fStack_274 = fStack_274 + fStack_274 + -1.0;
          fStack_270 = fStack_270 + fStack_270 + -1.0;
          fStack_26c = fStack_26c + fStack_26c + -1.0;
          bhit.i = 0;
          bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fStack_394,local_398);
          bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar401,fStack_390);
          bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_3a4,local_3a8);
          bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar434,fStack_3a0);
          bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_3b4,local_3b8);
          bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar364,fStack_3b0);
          bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_3c4,local_3c8);
          bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar409,fStack_3c0);
          bhit.U.field_0 = aVar389;
          bhit.V.field_0.v[0] = local_278;
          bhit.V.field_0.v[1] = fStack_274;
          bhit.V.field_0.v[2] = fStack_270;
          bhit.V.field_0.v[3] = fStack_26c;
          bhit.T.field_0 = aVar396;
          bhit.N = iVar305;
          bhit.valid.field_0 = aVar203;
          if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            fVar423 = 1.0 / fVar147;
            bhit.vu.field_0.v[0] = fVar423 * (aVar389.v[0] + 0.0);
            bhit.vu.field_0.v[1] = fVar423 * (aVar389.v[1] + 1.0);
            bhit.vu.field_0.v[2] = fVar423 * (aVar389.v[2] + 2.0);
            bhit.vu.field_0.v[3] = fVar423 * (aVar389.v[3] + 3.0);
            bhit.vv.field_0._0_8_ = CONCAT44(fStack_274,local_278);
            bhit.vv.field_0._8_8_ = CONCAT44(fStack_26c,fStack_270);
            bhit.vt.field_0 = aVar396;
            auVar251._0_4_ = aVar203._0_4_ & (uint)fVar321;
            auVar251._4_4_ = aVar203._4_4_ & (uint)fVar331;
            auVar251._8_4_ = aVar203._8_4_ & (uint)fVar341;
            auVar251._12_4_ = aVar203._12_4_ & (uint)fVar343;
            auVar296._0_8_ = CONCAT44(~aVar203._4_4_,~aVar203._0_4_) & 0x7f8000007f800000;
            auVar296._8_4_ = ~aVar203._8_4_ & 0x7f800000;
            auVar296._12_4_ = ~aVar203._12_4_ & 0x7f800000;
            auVar296 = auVar296 | auVar251;
            auVar314._4_4_ = auVar296._0_4_;
            auVar314._0_4_ = auVar296._4_4_;
            auVar314._8_4_ = auVar296._12_4_;
            auVar314._12_4_ = auVar296._8_4_;
            auVar177 = minps(auVar314,auVar296);
            auVar252._0_8_ = auVar177._8_8_;
            auVar252._8_4_ = auVar177._0_4_;
            auVar252._12_4_ = auVar177._4_4_;
            auVar177 = minps(auVar252,auVar177);
            auVar253._0_8_ =
                 CONCAT44(-(uint)(auVar177._4_4_ == auVar296._4_4_) & aVar203._4_4_,
                          -(uint)(auVar177._0_4_ == auVar296._0_4_) & aVar203._0_4_);
            auVar253._8_4_ = -(uint)(auVar177._8_4_ == auVar296._8_4_) & aVar203._8_4_;
            auVar253._12_4_ = -(uint)(auVar177._12_4_ == auVar296._12_4_) & aVar203._12_4_;
            iVar214 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar253);
            aVar204 = aVar203;
            if (iVar214 != 0) {
              aVar204.i[2] = auVar253._8_4_;
              aVar204._0_8_ = auVar253._0_8_;
              aVar204.i[3] = auVar253._12_4_;
            }
            uVar140 = movmskps(iVar214,(undefined1  [16])aVar204);
            lVar138 = 0;
            if (uVar140 != 0) {
              for (; (uVar140 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
              }
            }
            valid.field_0 = aVar203;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar423 = bhit.vu.field_0.v[lVar138];
              fVar225 = 1.0 - fVar423;
              fVar221 = fVar423 * 3.0;
              fVar321 = ((fVar221 + 2.0) * (fVar225 + fVar225) + fVar225 * -3.0 * fVar225) * 0.5;
              fVar268 = (fVar225 * -2.0 * fVar423 + fVar423 * fVar423) * 0.5;
              fVar270 = (fVar423 * fVar221 + (fVar221 + -5.0) * (fVar423 + fVar423)) * 0.5;
              fVar221 = bhit.vv.field_0.v[lVar138];
              fVar225 = (fVar423 * (fVar225 + fVar225) - fVar225 * fVar225) * 0.5;
              *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar138];
              *(float *)(ray + k * 4 + 0xc0) =
                   fVar225 * local_398 +
                   fVar270 * local_3a8 + fVar321 * local_3b8 + fVar268 * local_3c8;
              *(float *)(ray + k * 4 + 0xd0) =
                   fVar225 * fStack_394 +
                   fVar270 * fStack_3a4 + fVar321 * fStack_3b4 + fVar268 * fStack_3c4;
              *(float *)(ray + k * 4 + 0xe0) =
                   fVar225 * fStack_390 +
                   fVar270 * fStack_3a0 + fVar321 * fStack_3b0 + fVar268 * fStack_3c0;
              *(float *)(ray + k * 4 + 0xf0) = fVar423;
              *(float *)(ray + k * 4 + 0x100) = fVar221;
              *(uint *)(ray + k * 4 + 0x110) = uVar139;
              *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_2b0;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              pRVar133 = (RTCIntersectArguments *)context;
            }
            else {
              local_4c8 = CONCAT44((uint)uStack_2b0,(uint)uStack_2b0);
              uStack_4c0._0_4_ = (uint)uStack_2b0;
              uStack_4c0._4_4_ = (uint)uStack_2b0;
              local_478 = CONCAT44(uVar139,uVar139);
              uStack_470._0_4_ = (float)uVar139;
              uStack_470._4_4_ = uVar139;
              auVar177 = *(undefined1 (*) [16])
                          (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
              _local_528 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              while( true ) {
                local_c8 = bhit.vu.field_0.v[lVar138];
                local_b8 = bhit.vv.field_0.v[lVar138];
                *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar138];
                fVar270 = 1.0 - local_c8;
                fVar423 = local_c8 * 3.0;
                fVar268 = ((fVar423 + 2.0) * (fVar270 + fVar270) + fVar270 * -3.0 * fVar270) * 0.5;
                fVar221 = (local_c8 * local_c8 + fVar270 * -2.0 * local_c8) * 0.5;
                fVar225 = (local_c8 * fVar423 + (fVar423 + -5.0) * (local_c8 + local_c8)) * 0.5;
                args.context = context->user;
                fVar423 = (local_c8 * (fVar270 + fVar270) - fVar270 * fVar270) * 0.5;
                local_f8 = fVar423 * local_398 +
                           fVar225 * local_3a8 + fVar268 * local_3b8 + fVar221 * local_3c8;
                local_e8 = fVar423 * fStack_394 +
                           fVar225 * fStack_3a4 + fVar268 * fStack_3b4 + fVar221 * fStack_3c4;
                local_d8 = fVar423 * fStack_390 +
                           fVar225 * fStack_3a0 + fVar268 * fStack_3b0 + fVar221 * fStack_3c0;
                fStack_f4 = local_f8;
                fStack_f0 = local_f8;
                fStack_ec = local_f8;
                fStack_e4 = local_e8;
                fStack_e0 = local_e8;
                fStack_dc = local_e8;
                fStack_d4 = local_d8;
                fStack_d0 = local_d8;
                fStack_cc = local_d8;
                fStack_c4 = local_c8;
                fStack_c0 = local_c8;
                fStack_bc = local_c8;
                fStack_b4 = local_b8;
                fStack_b0 = local_b8;
                fStack_ac = local_b8;
                local_a8 = local_478;
                uStack_a0 = uStack_470;
                local_98 = local_4c8;
                uStack_90 = uStack_4c0;
                local_88 = (args.context)->instID[0];
                uStack_84 = local_88;
                uStack_80 = local_88;
                uStack_7c = local_88;
                local_78 = (args.context)->instPrimID[0];
                uStack_74 = local_78;
                uStack_70 = local_78;
                uStack_6c = local_78;
                args.valid = (int *)local_3f8;
                pRVar133 = (RTCIntersectArguments *)pGVar26->userPtr;
                args.hit = (RTCHitN *)&local_f8;
                args.N = 4;
                p_Var128 = pGVar26->intersectionFilterN;
                auVar446._8_8_ = pGVar134;
                auVar446._0_8_ = p_Var128;
                local_3f8 = auVar177;
                args.geometryUserPtr = pRVar133;
                args.ray = (RTCRayN *)ray;
                if (p_Var128 != (RTCFilterFunctionN)0x0) {
                  auVar446 = (*p_Var128)(&args);
                }
                pGVar134 = auVar446._8_8_;
                auVar263._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                auVar263._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                auVar263._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                auVar263._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                uVar140 = movmskps(auVar446._0_4_,auVar263);
                pRVar129 = (RTCRayN *)(ulong)(uVar140 ^ 0xf);
                if ((uVar140 ^ 0xf) == 0) {
                  auVar263 = auVar263 ^ _DAT_01f46b70;
                }
                else {
                  pRVar133 = context->args;
                  pRVar130 = (RTCIntersectArguments *)pRVar133->filter;
                  auVar126._8_8_ = pGVar134;
                  auVar126._0_8_ = pRVar130;
                  auVar447._8_8_ = pGVar134;
                  auVar447._0_8_ = pRVar130;
                  if ((pRVar130 != (RTCIntersectArguments *)0x0) &&
                     ((((ulong)*(Scene **)&pRVar133->flags & 2) != 0 ||
                      (auVar447 = auVar126, ((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar447 = (*(code *)pRVar130)(&args);
                  }
                  pGVar134 = auVar447._8_8_;
                  auVar210._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                  auVar210._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                  auVar210._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                  auVar210._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                  auVar263 = auVar210 ^ _DAT_01f46b70;
                  uVar140 = movmskps(auVar447._0_4_,auVar210);
                  pRVar129 = (RTCRayN *)(ulong)(uVar140 ^ 0xf);
                  if ((uVar140 ^ 0xf) != 0) {
                    uVar140 = *(uint *)(args.hit + 4);
                    uVar141 = *(uint *)(args.hit + 8);
                    uVar142 = *(uint *)(args.hit + 0xc);
                    *(uint *)(args.ray + 0xc0) =
                         ~auVar210._0_4_ & *(uint *)args.hit |
                         *(uint *)(args.ray + 0xc0) & auVar210._0_4_;
                    *(uint *)(args.ray + 0xc4) =
                         ~auVar210._4_4_ & uVar140 | *(uint *)(args.ray + 0xc4) & auVar210._4_4_;
                    *(uint *)(args.ray + 200) =
                         ~auVar210._8_4_ & uVar141 | *(uint *)(args.ray + 200) & auVar210._8_4_;
                    *(uint *)(args.ray + 0xcc) =
                         ~auVar210._12_4_ & uVar142 | *(uint *)(args.ray + 0xcc) & auVar210._12_4_;
                    uVar140 = *(uint *)(args.hit + 0x14);
                    uVar141 = *(uint *)(args.hit + 0x18);
                    uVar142 = *(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0xd0) =
                         ~auVar210._0_4_ & *(uint *)(args.hit + 0x10) |
                         *(uint *)(args.ray + 0xd0) & auVar210._0_4_;
                    *(uint *)(args.ray + 0xd4) =
                         ~auVar210._4_4_ & uVar140 | *(uint *)(args.ray + 0xd4) & auVar210._4_4_;
                    *(uint *)(args.ray + 0xd8) =
                         ~auVar210._8_4_ & uVar141 | *(uint *)(args.ray + 0xd8) & auVar210._8_4_;
                    *(uint *)(args.ray + 0xdc) =
                         ~auVar210._12_4_ & uVar142 | *(uint *)(args.ray + 0xdc) & auVar210._12_4_;
                    uVar140 = *(uint *)(args.hit + 0x24);
                    uVar141 = *(uint *)(args.hit + 0x28);
                    uVar142 = *(uint *)(args.hit + 0x2c);
                    *(uint *)(args.ray + 0xe0) =
                         ~auVar210._0_4_ & *(uint *)(args.hit + 0x20) |
                         *(uint *)(args.ray + 0xe0) & auVar210._0_4_;
                    *(uint *)(args.ray + 0xe4) =
                         ~auVar210._4_4_ & uVar140 | *(uint *)(args.ray + 0xe4) & auVar210._4_4_;
                    *(uint *)(args.ray + 0xe8) =
                         ~auVar210._8_4_ & uVar141 | *(uint *)(args.ray + 0xe8) & auVar210._8_4_;
                    *(uint *)(args.ray + 0xec) =
                         ~auVar210._12_4_ & uVar142 | *(uint *)(args.ray + 0xec) & auVar210._12_4_;
                    uVar140 = *(uint *)(args.hit + 0x34);
                    uVar141 = *(uint *)(args.hit + 0x38);
                    uVar142 = *(uint *)(args.hit + 0x3c);
                    *(uint *)(args.ray + 0xf0) =
                         ~auVar210._0_4_ & *(uint *)(args.hit + 0x30) |
                         *(uint *)(args.ray + 0xf0) & auVar210._0_4_;
                    *(uint *)(args.ray + 0xf4) =
                         ~auVar210._4_4_ & uVar140 | *(uint *)(args.ray + 0xf4) & auVar210._4_4_;
                    *(uint *)(args.ray + 0xf8) =
                         ~auVar210._8_4_ & uVar141 | *(uint *)(args.ray + 0xf8) & auVar210._8_4_;
                    *(uint *)(args.ray + 0xfc) =
                         ~auVar210._12_4_ & uVar142 | *(uint *)(args.ray + 0xfc) & auVar210._12_4_;
                    uVar140 = *(uint *)(args.hit + 0x44);
                    uVar141 = *(uint *)(args.hit + 0x48);
                    uVar142 = *(uint *)(args.hit + 0x4c);
                    *(uint *)(args.ray + 0x100) =
                         ~auVar210._0_4_ & *(uint *)(args.hit + 0x40) |
                         *(uint *)(args.ray + 0x100) & auVar210._0_4_;
                    *(uint *)(args.ray + 0x104) =
                         ~auVar210._4_4_ & uVar140 | *(uint *)(args.ray + 0x104) & auVar210._4_4_;
                    *(uint *)(args.ray + 0x108) =
                         ~auVar210._8_4_ & uVar141 | *(uint *)(args.ray + 0x108) & auVar210._8_4_;
                    *(uint *)(args.ray + 0x10c) =
                         ~auVar210._12_4_ & uVar142 | *(uint *)(args.ray + 0x10c) & auVar210._12_4_;
                    uVar140 = *(uint *)(args.hit + 0x54);
                    uVar141 = *(uint *)(args.hit + 0x58);
                    uVar142 = *(uint *)(args.hit + 0x5c);
                    *(uint *)(args.ray + 0x110) =
                         *(uint *)(args.ray + 0x110) & auVar210._0_4_ |
                         ~auVar210._0_4_ & *(uint *)(args.hit + 0x50);
                    *(uint *)(args.ray + 0x114) =
                         *(uint *)(args.ray + 0x114) & auVar210._4_4_ | ~auVar210._4_4_ & uVar140;
                    *(uint *)(args.ray + 0x118) =
                         *(uint *)(args.ray + 0x118) & auVar210._8_4_ | ~auVar210._8_4_ & uVar141;
                    *(uint *)(args.ray + 0x11c) =
                         *(uint *)(args.ray + 0x11c) & auVar210._12_4_ | ~auVar210._12_4_ & uVar142;
                    uVar140 = *(uint *)(args.hit + 100);
                    uVar141 = *(uint *)(args.hit + 0x68);
                    uVar142 = *(uint *)(args.hit + 0x6c);
                    *(uint *)(args.ray + 0x120) =
                         *(uint *)(args.ray + 0x120) & auVar210._0_4_ |
                         ~auVar210._0_4_ & *(uint *)(args.hit + 0x60);
                    *(uint *)(args.ray + 0x124) =
                         *(uint *)(args.ray + 0x124) & auVar210._4_4_ | ~auVar210._4_4_ & uVar140;
                    *(uint *)(args.ray + 0x128) =
                         *(uint *)(args.ray + 0x128) & auVar210._8_4_ | ~auVar210._8_4_ & uVar141;
                    *(uint *)(args.ray + 300) =
                         *(uint *)(args.ray + 300) & auVar210._12_4_ | ~auVar210._12_4_ & uVar142;
                    uVar140 = *(uint *)(args.hit + 0x74);
                    uVar141 = *(uint *)(args.hit + 0x78);
                    uVar142 = *(uint *)(args.hit + 0x7c);
                    *(uint *)(args.ray + 0x130) =
                         ~auVar210._0_4_ & *(uint *)(args.hit + 0x70) |
                         *(uint *)(args.ray + 0x130) & auVar210._0_4_;
                    *(uint *)(args.ray + 0x134) =
                         ~auVar210._4_4_ & uVar140 | *(uint *)(args.ray + 0x134) & auVar210._4_4_;
                    *(uint *)(args.ray + 0x138) =
                         ~auVar210._8_4_ & uVar141 | *(uint *)(args.ray + 0x138) & auVar210._8_4_;
                    *(uint *)(args.ray + 0x13c) =
                         ~auVar210._12_4_ & uVar142 | *(uint *)(args.ray + 0x13c) & auVar210._12_4_;
                    *(undefined1 (*) [16])(args.ray + 0x140) =
                         ~auVar210 & *(undefined1 (*) [16])(args.hit + 0x80) |
                         *(undefined1 (*) [16])(args.ray + 0x140) & auVar210;
                    pRVar129 = args.ray;
                    pRVar133 = (RTCIntersectArguments *)args.hit;
                  }
                }
                auVar264._0_4_ = auVar263._0_4_ << 0x1f;
                auVar264._4_4_ = auVar263._4_4_ << 0x1f;
                auVar264._8_4_ = auVar263._8_4_ << 0x1f;
                auVar264._12_4_ = auVar263._12_4_ << 0x1f;
                iVar214 = movmskps((int)pRVar129,auVar264);
                if (iVar214 == 0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_528._0_4_;
                }
                else {
                  local_528._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  register0x00001244 = 0.0;
                  fStack_520 = 0.0;
                  uStack_51c = 0;
                }
                *(undefined4 *)(local_3f8 + lVar138 * 4 + -0x10) = 0;
                valid.field_0.i[0] = -(uint)(fVar321 <= (float)local_528._0_4_) & valid.field_0.i[0]
                ;
                valid.field_0.i[1] = -(uint)(fVar331 <= (float)local_528._0_4_) & valid.field_0.i[1]
                ;
                valid.field_0.i[2] = -(uint)(fVar341 <= (float)local_528._0_4_) & valid.field_0.i[2]
                ;
                valid.field_0.i[3] = -(uint)(fVar343 <= (float)local_528._0_4_) & valid.field_0.i[3]
                ;
                iVar214 = movmskps(iVar214,(undefined1  [16])valid.field_0);
                if (iVar214 == 0) break;
                auVar265._0_4_ = valid.field_0.i[0] & (uint)fVar321;
                auVar265._4_4_ = valid.field_0.i[1] & (uint)fVar331;
                auVar265._8_4_ = valid.field_0.i[2] & (uint)fVar341;
                auVar265._12_4_ = valid.field_0.i[3] & (uint)fVar343;
                auVar302._0_8_ =
                     CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                auVar302._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                auVar302._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                auVar302 = auVar302 | auVar265;
                auVar320._4_4_ = auVar302._0_4_;
                auVar320._0_4_ = auVar302._4_4_;
                auVar320._8_4_ = auVar302._12_4_;
                auVar320._12_4_ = auVar302._8_4_;
                auVar227 = minps(auVar320,auVar302);
                auVar266._0_8_ = auVar227._8_8_;
                auVar266._8_4_ = auVar227._0_4_;
                auVar266._12_4_ = auVar227._4_4_;
                auVar227 = minps(auVar266,auVar227);
                auVar267._0_8_ =
                     CONCAT44(-(uint)(auVar227._4_4_ == auVar302._4_4_) & valid.field_0.i[1],
                              -(uint)(auVar227._0_4_ == auVar302._0_4_) & valid.field_0.i[0]);
                auVar267._8_4_ = -(uint)(auVar227._8_4_ == auVar302._8_4_) & valid.field_0.i[2];
                auVar267._12_4_ = -(uint)(auVar227._12_4_ == auVar302._12_4_) & valid.field_0.i[3];
                iVar214 = movmskps(iVar214,auVar267);
                aVar211 = valid.field_0;
                if (iVar214 != 0) {
                  aVar211.i[2] = auVar267._8_4_;
                  aVar211._0_8_ = auVar267._0_8_;
                  aVar211.i[3] = auVar267._12_4_;
                }
                uVar135 = movmskps(iVar214,(undefined1  [16])aVar211);
                uVar131 = CONCAT44((int)((ulong)pRVar129 >> 0x20),uVar135);
                lVar138 = 0;
                if (uVar131 != 0) {
                  for (; (uVar131 >> lVar138 & 1) == 0; lVar138 = lVar138 + 1) {
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar135 = SUB84(pRVar133,0);
    if (4 < iVar305) {
      local_58 = iVar305;
      iStack_54 = iVar305;
      iStack_50 = iVar305;
      iStack_4c = iVar305;
      local_388._4_4_ = local_388._0_4_;
      fStack_380 = (float)local_388._0_4_;
      fStack_37c = (float)local_388._0_4_;
      local_68 = 1.0 / fVar147;
      fStack_64 = local_68;
      fStack_60 = local_68;
      fStack_5c = local_68;
      local_2b8 = CONCAT44((uint)uStack_2b0,(uint)uStack_2b0);
      uStack_2b0._4_4_ = (uint)uStack_2b0;
      local_2c8 = CONCAT44(uVar139,uVar139);
      uStack_2c0._0_4_ = uVar139;
      uStack_2c0._4_4_ = uVar139;
      for (lVar138 = 4; uVar135 = SUB84(pRVar133,0), lVar138 < iVar305; lVar138 = lVar138 + 4) {
        uVar141 = (uint)lVar138;
        pRVar133 = (RTCIntersectArguments *)(catmullrom_basis0 + lVar132);
        pauVar8 = (undefined1 (*) [12])((long)&pRVar133->flags + lVar138 * 4);
        fVar423 = *(float *)*pauVar8;
        fVar147 = *(float *)(*pauVar8 + 4);
        fVar221 = *(float *)(*pauVar8 + 8);
        auVar66 = *pauVar8;
        fVar225 = *(float *)pauVar8[1];
        pfVar2 = (float *)(lVar132 + 0x22047f0 + lVar138 * 4);
        fVar268 = *pfVar2;
        fVar270 = pfVar2[1];
        fVar321 = pfVar2[2];
        fVar331 = pfVar2[3];
        pfVar2 = (float *)(lVar132 + 0x2204c74 + lVar138 * 4);
        fVar341 = *pfVar2;
        fVar343 = pfVar2[1];
        fVar346 = pfVar2[2];
        fVar372 = pfVar2[3];
        pauVar8 = (undefined1 (*) [12])(lVar132 + 0x22050f8 + lVar138 * 4);
        fVar375 = *(float *)*pauVar8;
        fVar378 = *(float *)(*pauVar8 + 4);
        fVar379 = *(float *)(*pauVar8 + 8);
        auVar63 = *pauVar8;
        fVar380 = *(float *)pauVar8[1];
        fVar345 = fVar355 * fVar423 + fVar356 * fVar268 + fVar399 * fVar341 + fVar213 * fVar375;
        fVar357 = fVar355 * fVar147 + fVar356 * fVar270 + fVar399 * fVar343 + fVar213 * fVar378;
        fVar361 = fVar355 * fVar221 + fVar356 * fVar321 + fVar399 * fVar346 + fVar213 * fVar379;
        fVar362 = fVar355 * fVar225 + fVar356 * fVar331 + fVar399 * fVar372 + fVar213 * fVar380;
        fVar363 = fVar414 * fVar423 + fVar360 * fVar268 + fVar421 * fVar341 + fVar218 * fVar375;
        fVar365 = fVar414 * fVar147 + fVar360 * fVar270 + fVar421 * fVar343 + fVar218 * fVar378;
        fVar369 = fVar414 * fVar221 + fVar360 * fVar321 + fVar421 * fVar346 + fVar218 * fVar379;
        fVar373 = fVar414 * fVar225 + fVar360 * fVar331 + fVar421 * fVar372 + fVar218 * fVar380;
        auVar433._0_4_ =
             fVar401 * fVar423 + fVar434 * fVar268 + fVar364 * fVar341 + fVar409 * fVar375;
        auVar433._4_4_ =
             fVar401 * fVar147 + fVar434 * fVar270 + fVar364 * fVar343 + fVar409 * fVar378;
        auVar433._8_4_ =
             fVar401 * fVar221 + fVar434 * fVar321 + fVar364 * fVar346 + fVar409 * fVar379;
        auVar433._12_4_ =
             fVar401 * fVar225 + fVar434 * fVar331 + fVar364 * fVar372 + fVar409 * fVar380;
        pfVar2 = (float *)(catmullrom_basis1 + lVar132 + lVar138 * 4);
        fVar423 = *pfVar2;
        fVar147 = pfVar2[1];
        fVar221 = pfVar2[2];
        fVar375 = pfVar2[3];
        pfVar2 = (float *)(lVar132 + 0x2206c10 + lVar138 * 4);
        fVar378 = *pfVar2;
        fVar379 = pfVar2[1];
        fVar381 = pfVar2[2];
        fVar412 = pfVar2[3];
        pfVar2 = (float *)(lVar132 + 0x2207094 + lVar138 * 4);
        fVar413 = *pfVar2;
        fVar415 = pfVar2[1];
        fVar422 = pfVar2[2];
        fVar424 = pfVar2[3];
        pauVar8 = (undefined1 (*) [12])(lVar132 + 0x2207518 + lVar138 * 4);
        fVar425 = *(float *)*pauVar8;
        fVar426 = *(float *)(*pauVar8 + 4);
        fVar441 = *(float *)(*pauVar8 + 8);
        auVar68 = *pauVar8;
        fVar445 = *(float *)pauVar8[1];
        fVar322 = fVar355 * fVar423 + fVar356 * fVar378 + fVar399 * fVar413 + fVar213 * fVar425;
        fVar325 = fVar355 * fVar147 + fVar356 * fVar379 + fVar399 * fVar415 + fVar213 * fVar426;
        fVar328 = fVar355 * fVar221 + fVar356 * fVar381 + fVar399 * fVar422 + fVar213 * fVar441;
        fVar344 = fVar355 * fVar375 + fVar356 * fVar412 + fVar399 * fVar424 + fVar213 * fVar445;
        fVar376 = fVar414 * fVar423 + fVar360 * fVar378 + fVar421 * fVar413 + fVar218 * fVar425;
        fVar430 = fVar414 * fVar147 + fVar360 * fVar379 + fVar421 * fVar415 + fVar218 * fVar426;
        fVar435 = fVar414 * fVar221 + fVar360 * fVar381 + fVar421 * fVar422 + fVar218 * fVar441;
        fVar436 = fVar414 * fVar375 + fVar360 * fVar412 + fVar421 * fVar424 + fVar218 * fVar445;
        auVar428._0_4_ =
             fVar401 * fVar423 + fVar434 * fVar378 + fVar364 * fVar413 + fVar409 * fVar425;
        auVar428._4_4_ =
             fVar401 * fVar147 + fVar434 * fVar379 + fVar364 * fVar415 + fVar409 * fVar426;
        auVar428._8_4_ =
             fVar401 * fVar221 + fVar434 * fVar381 + fVar364 * fVar422 + fVar409 * fVar441;
        auVar428._12_4_ =
             fVar401 * fVar375 + fVar434 * fVar412 + fVar364 * fVar424 + fVar409 * fVar445;
        fVar425 = fVar322 - fVar345;
        fVar426 = fVar325 - fVar357;
        fVar441 = fVar328 - fVar361;
        fVar367 = fVar344 - fVar362;
        fVar219 = fVar376 - fVar363;
        fVar222 = fVar430 - fVar365;
        fVar224 = fVar435 - fVar369;
        fVar307 = fVar436 - fVar373;
        fVar402 = fVar363 * fVar425 - fVar345 * fVar219;
        fVar371 = fVar365 * fVar426 - fVar357 * fVar222;
        fVar410 = fVar369 * fVar441 - fVar361 * fVar224;
        fVar148 = fVar373 * fVar367 - fVar362 * fVar307;
        auVar177 = maxps(auVar433,auVar428);
        bVar100 = fVar402 * fVar402 <=
                  auVar177._0_4_ * auVar177._0_4_ * (fVar425 * fVar425 + fVar219 * fVar219) &&
                  (int)uVar141 < local_58;
        auVar315._0_4_ = -(uint)bVar100;
        bVar101 = fVar371 * fVar371 <=
                  auVar177._4_4_ * auVar177._4_4_ * (fVar426 * fVar426 + fVar222 * fVar222) &&
                  (int)(uVar141 | 1) < iStack_54;
        auVar315._4_4_ = -(uint)bVar101;
        bVar95 = fVar410 * fVar410 <=
                 auVar177._8_4_ * auVar177._8_4_ * (fVar441 * fVar441 + fVar224 * fVar224) &&
                 (int)(uVar141 | 2) < iStack_50;
        auVar315._8_4_ = -(uint)bVar95;
        bVar90 = fVar148 * fVar148 <=
                 auVar177._12_4_ * auVar177._12_4_ * (fVar367 * fVar367 + fVar307 * fVar307) &&
                 (int)(uVar141 | 3) < iStack_4c;
        auVar315._12_4_ = -(uint)bVar90;
        uVar140 = movmskps((int)pGVar134,auVar315);
        pGVar134 = (Geometry *)(ulong)uVar140;
        if (uVar140 != 0) {
          local_528._0_4_ = auVar68._0_4_;
          stack0xfffffffffffffadc = auVar68._4_4_;
          fStack_520 = auVar68._8_4_;
          fVar323 = (float)local_528._0_4_ * fVar146 + fVar413 * fVar342 + fVar378 * fVar390 +
                    fVar423 * fVar368;
          fVar326 = stack0xfffffffffffffadc * fVar146 + fVar415 * fVar342 + fVar379 * fVar390 +
                    fVar147 * fVar368;
          fVar329 = fStack_520 * fVar146 + fVar422 * fVar342 + fVar381 * fVar390 + fVar221 * fVar368
          ;
          fVar366 = fVar445 * fVar146 + fVar424 * fVar342 + fVar412 * fVar390 + fVar375 * fVar368;
          local_328 = auVar66._0_4_;
          fStack_324 = auVar66._4_4_;
          fStack_320 = auVar66._8_4_;
          local_478._0_4_ = auVar63._0_4_;
          local_478._4_4_ = auVar63._4_4_;
          uStack_470._0_4_ = auVar63._8_4_;
          fVar271 = (float)local_478 * fVar146 + fVar341 * fVar342 + fVar268 * fVar390 +
                    local_328 * fVar368;
          fVar272 = local_478._4_4_ * fVar146 + fVar343 * fVar342 + fVar270 * fVar390 +
                    fStack_324 * fVar368;
          fVar308 = (float)uStack_470 * fVar146 + fVar346 * fVar342 + fVar321 * fVar390 +
                    fStack_320 * fVar368;
          fVar309 = fVar380 * fVar146 + fVar372 * fVar342 + fVar331 * fVar390 + fVar225 * fVar368;
          pfVar2 = (float *)(lVar132 + 0x220557c + lVar138 * 4);
          fVar423 = *pfVar2;
          fVar147 = pfVar2[1];
          fVar221 = pfVar2[2];
          fVar225 = pfVar2[3];
          pfVar2 = (float *)(lVar132 + 0x2205a00 + lVar138 * 4);
          fVar268 = *pfVar2;
          fVar270 = pfVar2[1];
          fVar321 = pfVar2[2];
          fVar331 = pfVar2[3];
          pfVar2 = (float *)(lVar132 + 0x2205e84 + lVar138 * 4);
          fVar341 = *pfVar2;
          fVar343 = pfVar2[1];
          fVar346 = pfVar2[2];
          fVar372 = pfVar2[3];
          pfVar2 = (float *)(lVar132 + 0x2206308 + lVar138 * 4);
          fVar375 = *pfVar2;
          fVar378 = pfVar2[1];
          fVar379 = pfVar2[2];
          fVar380 = pfVar2[3];
          fVar374 = fVar355 * fVar423 + fVar356 * fVar268 + fVar399 * fVar341 + fVar213 * fVar375;
          fVar377 = fVar355 * fVar147 + fVar356 * fVar270 + fVar399 * fVar343 + fVar213 * fVar378;
          fVar384 = fVar355 * fVar221 + fVar356 * fVar321 + fVar399 * fVar346 + fVar213 * fVar379;
          fVar391 = fVar355 * fVar225 + fVar356 * fVar331 + fVar399 * fVar372 + fVar213 * fVar380;
          fVar403 = fVar414 * fVar423 + fVar360 * fVar268 + fVar421 * fVar341 + fVar218 * fVar375;
          fVar411 = fVar414 * fVar147 + fVar360 * fVar270 + fVar421 * fVar343 + fVar218 * fVar378;
          fVar226 = fVar414 * fVar221 + fVar360 * fVar321 + fVar421 * fVar346 + fVar218 * fVar379;
          fVar269 = fVar414 * fVar225 + fVar360 * fVar331 + fVar421 * fVar372 + fVar218 * fVar380;
          pfVar2 = (float *)(lVar132 + 0x220799c + lVar138 * 4);
          fVar381 = *pfVar2;
          fVar412 = pfVar2[1];
          fVar413 = pfVar2[2];
          fVar415 = pfVar2[3];
          pfVar2 = (float *)(lVar132 + 0x22082a4 + lVar138 * 4);
          fVar422 = *pfVar2;
          fVar424 = pfVar2[1];
          fVar445 = pfVar2[2];
          fVar402 = pfVar2[3];
          pfVar2 = (float *)(lVar132 + 0x2208728 + lVar138 * 4);
          fVar371 = *pfVar2;
          fVar410 = pfVar2[1];
          fVar148 = pfVar2[2];
          fVar438 = pfVar2[3];
          pfVar2 = (float *)(lVar132 + 0x2207e20 + lVar138 * 4);
          fVar439 = *pfVar2;
          fVar442 = pfVar2[1];
          fVar443 = pfVar2[2];
          fVar400 = pfVar2[3];
          fVar392 = fVar355 * fVar381 + fVar356 * fVar439 + fVar399 * fVar422 + fVar213 * fVar371;
          fVar393 = fVar355 * fVar412 + fVar356 * fVar442 + fVar399 * fVar424 + fVar213 * fVar410;
          fVar431 = fVar355 * fVar413 + fVar356 * fVar443 + fVar399 * fVar445 + fVar213 * fVar148;
          fVar437 = fVar355 * fVar415 + fVar356 * fVar400 + fVar399 * fVar402 + fVar213 * fVar438;
          fVar324 = fVar414 * fVar381 + fVar360 * fVar439 + fVar421 * fVar422 + fVar218 * fVar371;
          fVar327 = fVar414 * fVar412 + fVar360 * fVar442 + fVar421 * fVar424 + fVar218 * fVar410;
          fVar330 = fVar414 * fVar413 + fVar360 * fVar443 + fVar421 * fVar445 + fVar218 * fVar148;
          fVar370 = fVar414 * fVar415 + fVar360 * fVar400 + fVar421 * fVar402 + fVar218 * fVar438;
          auVar408._0_8_ = CONCAT44(fVar377,fVar374) & 0x7fffffff7fffffff;
          auVar408._8_4_ = ABS(fVar384);
          auVar408._12_4_ = ABS(fVar391);
          auVar351._0_8_ = CONCAT44(fVar411,fVar403) & 0x7fffffff7fffffff;
          auVar351._8_4_ = ABS(fVar226);
          auVar351._12_4_ = ABS(fVar269);
          auVar177 = maxps(auVar408,auVar351);
          auVar419._0_8_ =
               CONCAT44(fVar147 * fVar368 +
                        fVar270 * fVar390 + fVar343 * fVar342 + fVar378 * fVar146,
                        fVar423 * fVar368 +
                        fVar268 * fVar390 + fVar341 * fVar342 + fVar375 * fVar146) &
               0x7fffffff7fffffff;
          auVar419._8_4_ =
               ABS(fVar221 * fVar368 + fVar321 * fVar390 + fVar346 * fVar342 + fVar379 * fVar146);
          auVar419._12_4_ =
               ABS(fVar225 * fVar368 + fVar331 * fVar390 + fVar372 * fVar342 + fVar380 * fVar146);
          auVar177 = maxps(auVar177,auVar419);
          uVar140 = -(uint)(local_418 <= auVar177._0_4_);
          uVar142 = -(uint)(local_418 <= auVar177._4_4_);
          uVar143 = -(uint)(local_418 <= auVar177._8_4_);
          uVar144 = -(uint)(local_418 <= auVar177._12_4_);
          auVar352._0_4_ = ~uVar140 & (uint)fVar425;
          auVar352._4_4_ = ~uVar142 & (uint)fVar426;
          auVar352._8_4_ = ~uVar143 & (uint)fVar441;
          auVar352._12_4_ = ~uVar144 & (uint)fVar367;
          auVar398._0_4_ = (uint)fVar374 & uVar140;
          auVar398._4_4_ = (uint)fVar377 & uVar142;
          auVar398._8_4_ = (uint)fVar384 & uVar143;
          auVar398._12_4_ = (uint)fVar391 & uVar144;
          auVar398 = auVar398 | auVar352;
          fVar343 = (float)(~uVar140 & (uint)fVar219 | (uint)fVar403 & uVar140);
          fVar372 = (float)(~uVar142 & (uint)fVar222 | (uint)fVar411 & uVar142);
          fVar403 = (float)(~uVar143 & (uint)fVar224 | (uint)fVar226 & uVar143);
          fVar411 = (float)(~uVar144 & (uint)fVar307 | (uint)fVar269 & uVar144);
          auVar420._0_8_ = CONCAT44(fVar393,fVar392) & 0x7fffffff7fffffff;
          auVar420._8_4_ = ABS(fVar431);
          auVar420._12_4_ = ABS(fVar437);
          auVar297._0_8_ = CONCAT44(fVar327,fVar324) & 0x7fffffff7fffffff;
          auVar297._8_4_ = ABS(fVar330);
          auVar297._12_4_ = ABS(fVar370);
          auVar177 = maxps(auVar420,auVar297);
          auVar205._0_8_ =
               CONCAT44(fVar412 * fVar368 +
                        fVar442 * fVar390 + fVar424 * fVar342 + fVar410 * fVar146,
                        fVar381 * fVar368 +
                        fVar439 * fVar390 + fVar422 * fVar342 + fVar371 * fVar146) &
               0x7fffffff7fffffff;
          auVar205._8_4_ =
               ABS(fVar413 * fVar368 + fVar443 * fVar390 + fVar445 * fVar342 + fVar148 * fVar146);
          auVar205._12_4_ =
               ABS(fVar415 * fVar368 + fVar400 * fVar390 + fVar402 * fVar342 + fVar438 * fVar146);
          auVar177 = maxps(auVar177,auVar205);
          uVar140 = -(uint)(local_418 <= auVar177._0_4_);
          uVar142 = -(uint)(local_418 <= auVar177._4_4_);
          uVar143 = -(uint)(local_418 <= auVar177._8_4_);
          uVar144 = -(uint)(local_418 <= auVar177._12_4_);
          fVar422 = (float)((uint)fVar392 & uVar140 | ~uVar140 & (uint)fVar425);
          fVar425 = (float)((uint)fVar393 & uVar142 | ~uVar142 & (uint)fVar426);
          fVar441 = (float)((uint)fVar431 & uVar143 | ~uVar143 & (uint)fVar441);
          fVar367 = (float)((uint)fVar437 & uVar144 | ~uVar144 & (uint)fVar367);
          fVar381 = (float)(~uVar140 & (uint)fVar219 | (uint)fVar324 & uVar140);
          fVar412 = (float)(~uVar142 & (uint)fVar222 | (uint)fVar327 & uVar142);
          fVar413 = (float)(~uVar143 & (uint)fVar224 | (uint)fVar330 & uVar143);
          fVar415 = (float)(~uVar144 & (uint)fVar307 | (uint)fVar370 & uVar144);
          fVar331 = auVar398._0_4_;
          fVar423 = auVar398._4_4_;
          fVar147 = auVar398._8_4_;
          fVar221 = auVar398._12_4_;
          auVar337._0_4_ = fVar343 * fVar343 + fVar331 * fVar331;
          auVar337._4_4_ = fVar372 * fVar372 + fVar423 * fVar423;
          auVar337._8_4_ = fVar403 * fVar403 + fVar147 * fVar147;
          auVar337._12_4_ = fVar411 * fVar411 + fVar221 * fVar221;
          auVar177 = rsqrtps(auVar352,auVar337);
          fVar225 = auVar177._0_4_;
          fVar268 = auVar177._4_4_;
          fVar270 = auVar177._8_4_;
          fVar321 = auVar177._12_4_;
          auVar353._0_4_ = fVar225 * fVar225 * auVar337._0_4_ * 0.5 * fVar225;
          auVar353._4_4_ = fVar268 * fVar268 * auVar337._4_4_ * 0.5 * fVar268;
          auVar353._8_4_ = fVar270 * fVar270 * auVar337._8_4_ * 0.5 * fVar270;
          auVar353._12_4_ = fVar321 * fVar321 * auVar337._12_4_ * 0.5 * fVar321;
          fVar375 = fVar225 * 1.5 - auVar353._0_4_;
          fVar378 = fVar268 * 1.5 - auVar353._4_4_;
          fVar379 = fVar270 * 1.5 - auVar353._8_4_;
          fVar380 = fVar321 * 1.5 - auVar353._12_4_;
          auVar338._0_4_ = fVar381 * fVar381 + fVar422 * fVar422;
          auVar338._4_4_ = fVar412 * fVar412 + fVar425 * fVar425;
          auVar338._8_4_ = fVar413 * fVar413 + fVar441 * fVar441;
          auVar338._12_4_ = fVar415 * fVar415 + fVar367 * fVar367;
          auVar177 = rsqrtps(auVar353,auVar338);
          fVar225 = auVar177._0_4_;
          fVar268 = auVar177._4_4_;
          fVar270 = auVar177._8_4_;
          fVar321 = auVar177._12_4_;
          fVar341 = fVar225 * 1.5 - fVar225 * fVar225 * auVar338._0_4_ * 0.5 * fVar225;
          fVar268 = fVar268 * 1.5 - fVar268 * fVar268 * auVar338._4_4_ * 0.5 * fVar268;
          fVar346 = fVar270 * 1.5 - fVar270 * fVar270 * auVar338._8_4_ * 0.5 * fVar270;
          fVar321 = fVar321 * 1.5 - fVar321 * fVar321 * auVar338._12_4_ * 0.5 * fVar321;
          fVar222 = fVar343 * fVar375 * auVar433._0_4_;
          fVar224 = fVar372 * fVar378 * auVar433._4_4_;
          fVar307 = fVar403 * fVar379 * auVar433._8_4_;
          fVar226 = fVar411 * fVar380 * auVar433._12_4_;
          fVar270 = -fVar331 * fVar375 * auVar433._0_4_;
          fVar331 = -fVar423 * fVar378 * auVar433._4_4_;
          fVar343 = -fVar147 * fVar379 * auVar433._8_4_;
          fVar372 = -fVar221 * fVar380 * auVar433._12_4_;
          fVar424 = fVar375 * 0.0 * auVar433._0_4_;
          fVar426 = fVar378 * 0.0 * auVar433._4_4_;
          fVar445 = fVar379 * 0.0 * auVar433._8_4_;
          fVar402 = fVar380 * 0.0 * auVar433._12_4_;
          fVar324 = fVar381 * fVar341 * auVar428._0_4_;
          fVar327 = fVar412 * fVar268 * auVar428._4_4_;
          fVar330 = fVar413 * fVar346 * auVar428._8_4_;
          fVar370 = fVar415 * fVar321 * auVar428._12_4_;
          fVar371 = fVar322 + fVar324;
          fVar410 = fVar325 + fVar327;
          fVar148 = fVar328 + fVar330;
          fVar219 = fVar344 + fVar370;
          fVar423 = -fVar422 * fVar341 * auVar428._0_4_;
          fVar147 = -fVar425 * fVar268 * auVar428._4_4_;
          fVar221 = -fVar441 * fVar346 * auVar428._8_4_;
          fVar225 = -fVar367 * fVar321 * auVar428._12_4_;
          fVar438 = fVar376 + fVar423;
          fVar439 = fVar430 + fVar147;
          fVar442 = fVar435 + fVar221;
          fVar443 = fVar436 + fVar225;
          fVar378 = fVar341 * 0.0 * auVar428._0_4_;
          fVar380 = fVar268 * 0.0 * auVar428._4_4_;
          fVar412 = fVar346 * 0.0 * auVar428._8_4_;
          fVar415 = fVar321 * 0.0 * auVar428._12_4_;
          fVar422 = fVar345 - fVar222;
          fVar425 = fVar357 - fVar224;
          fVar441 = fVar361 - fVar307;
          fVar367 = fVar362 - fVar226;
          fVar400 = fVar323 + fVar378;
          fVar403 = fVar326 + fVar380;
          fVar411 = fVar329 + fVar412;
          fVar269 = fVar366 + fVar415;
          fVar268 = fVar363 - fVar270;
          fVar321 = fVar365 - fVar331;
          fVar341 = fVar369 - fVar343;
          fVar346 = fVar373 - fVar372;
          fVar375 = fVar271 - fVar424;
          fVar379 = fVar272 - fVar426;
          fVar381 = fVar308 - fVar445;
          fVar413 = fVar309 - fVar402;
          uVar140 = -(uint)(0.0 < (fVar268 * (fVar400 - fVar375) - fVar375 * (fVar438 - fVar268)) *
                                  0.0 + (fVar375 * (fVar371 - fVar422) -
                                        (fVar400 - fVar375) * fVar422) * 0.0 +
                                        ((fVar438 - fVar268) * fVar422 -
                                        (fVar371 - fVar422) * fVar268));
          uVar142 = -(uint)(0.0 < (fVar321 * (fVar403 - fVar379) - fVar379 * (fVar439 - fVar321)) *
                                  0.0 + (fVar379 * (fVar410 - fVar425) -
                                        (fVar403 - fVar379) * fVar425) * 0.0 +
                                        ((fVar439 - fVar321) * fVar425 -
                                        (fVar410 - fVar425) * fVar321));
          uVar143 = -(uint)(0.0 < (fVar341 * (fVar411 - fVar381) - fVar381 * (fVar442 - fVar341)) *
                                  0.0 + (fVar381 * (fVar148 - fVar441) -
                                        (fVar411 - fVar381) * fVar441) * 0.0 +
                                        ((fVar442 - fVar341) * fVar441 -
                                        (fVar148 - fVar441) * fVar341));
          uVar144 = -(uint)(0.0 < (fVar346 * (fVar269 - fVar413) - fVar413 * (fVar443 - fVar346)) *
                                  0.0 + (fVar413 * (fVar219 - fVar367) -
                                        (fVar269 - fVar413) * fVar367) * 0.0 +
                                        ((fVar443 - fVar346) * fVar367 -
                                        (fVar219 - fVar367) * fVar346));
          fVar345 = (float)((uint)(fVar322 - fVar324) & uVar140 |
                           ~uVar140 & (uint)(fVar345 + fVar222));
          fVar357 = (float)((uint)(fVar325 - fVar327) & uVar142 |
                           ~uVar142 & (uint)(fVar357 + fVar224));
          fVar361 = (float)((uint)(fVar328 - fVar330) & uVar143 |
                           ~uVar143 & (uint)(fVar361 + fVar307));
          fVar362 = (float)((uint)(fVar344 - fVar370) & uVar144 |
                           ~uVar144 & (uint)(fVar362 + fVar226));
          fVar376 = (float)((uint)(fVar376 - fVar423) & uVar140 |
                           ~uVar140 & (uint)(fVar363 + fVar270));
          fVar365 = (float)((uint)(fVar430 - fVar147) & uVar142 |
                           ~uVar142 & (uint)(fVar365 + fVar331));
          fVar369 = (float)((uint)(fVar435 - fVar221) & uVar143 |
                           ~uVar143 & (uint)(fVar369 + fVar343));
          fVar373 = (float)((uint)(fVar436 - fVar225) & uVar144 |
                           ~uVar144 & (uint)(fVar373 + fVar372));
          fVar222 = (float)((uint)(fVar323 - fVar378) & uVar140 |
                           ~uVar140 & (uint)(fVar271 + fVar424));
          fVar224 = (float)((uint)(fVar326 - fVar380) & uVar142 |
                           ~uVar142 & (uint)(fVar272 + fVar426));
          fVar307 = (float)((uint)(fVar329 - fVar412) & uVar143 |
                           ~uVar143 & (uint)(fVar308 + fVar445));
          fVar322 = (float)((uint)(fVar366 - fVar415) & uVar144 |
                           ~uVar144 & (uint)(fVar309 + fVar402));
          fVar424 = (float)((uint)fVar422 & uVar140 | ~uVar140 & (uint)fVar371);
          fVar426 = (float)((uint)fVar425 & uVar142 | ~uVar142 & (uint)fVar410);
          fVar445 = (float)((uint)fVar441 & uVar143 | ~uVar143 & (uint)fVar148);
          fVar402 = (float)((uint)fVar367 & uVar144 | ~uVar144 & (uint)fVar219);
          fVar270 = (float)((uint)fVar268 & uVar140 | ~uVar140 & (uint)fVar438);
          fVar331 = (float)((uint)fVar321 & uVar142 | ~uVar142 & (uint)fVar439);
          fVar343 = (float)((uint)fVar341 & uVar143 | ~uVar143 & (uint)fVar442);
          fVar372 = (float)((uint)fVar346 & uVar144 | ~uVar144 & (uint)fVar443);
          fVar378 = (float)((uint)fVar375 & uVar140 | ~uVar140 & (uint)fVar400);
          fVar380 = (float)((uint)fVar379 & uVar142 | ~uVar142 & (uint)fVar403);
          fVar412 = (float)((uint)fVar381 & uVar143 | ~uVar143 & (uint)fVar411);
          fVar415 = (float)((uint)fVar413 & uVar144 | ~uVar144 & (uint)fVar269);
          fVar422 = (float)((uint)fVar371 & uVar140 | ~uVar140 & (uint)fVar422) - fVar345;
          fVar425 = (float)((uint)fVar410 & uVar142 | ~uVar142 & (uint)fVar425) - fVar357;
          fVar441 = (float)((uint)fVar148 & uVar143 | ~uVar143 & (uint)fVar441) - fVar361;
          fVar367 = (float)((uint)fVar219 & uVar144 | ~uVar144 & (uint)fVar367) - fVar362;
          fVar371 = (float)((uint)fVar438 & uVar140 | ~uVar140 & (uint)fVar268) - fVar376;
          fVar410 = (float)((uint)fVar439 & uVar142 | ~uVar142 & (uint)fVar321) - fVar365;
          fVar148 = (float)((uint)fVar442 & uVar143 | ~uVar143 & (uint)fVar341) - fVar369;
          fVar219 = (float)((uint)fVar443 & uVar144 | ~uVar144 & (uint)fVar346) - fVar373;
          fVar375 = (float)((uint)fVar400 & uVar140 | ~uVar140 & (uint)fVar375) - fVar222;
          fVar379 = (float)((uint)fVar403 & uVar142 | ~uVar142 & (uint)fVar379) - fVar224;
          fVar381 = (float)((uint)fVar411 & uVar143 | ~uVar143 & (uint)fVar381) - fVar307;
          fVar413 = (float)((uint)fVar269 & uVar144 | ~uVar144 & (uint)fVar413) - fVar322;
          fVar430 = fVar345 - fVar424;
          fVar435 = fVar357 - fVar426;
          fVar436 = fVar361 - fVar445;
          fVar438 = fVar362 - fVar402;
          fVar423 = fVar376 - fVar270;
          fVar147 = fVar365 - fVar331;
          fVar221 = fVar369 - fVar343;
          fVar225 = fVar373 - fVar372;
          fVar268 = fVar222 - fVar378;
          fVar321 = fVar224 - fVar380;
          fVar341 = fVar307 - fVar412;
          fVar346 = fVar322 - fVar415;
          fVar325 = (fVar376 * fVar375 - fVar222 * fVar371) * 0.0 +
                    (fVar222 * fVar422 - fVar345 * fVar375) * 0.0 +
                    (fVar345 * fVar371 - fVar376 * fVar422);
          fVar328 = (fVar365 * fVar379 - fVar224 * fVar410) * 0.0 +
                    (fVar224 * fVar425 - fVar357 * fVar379) * 0.0 +
                    (fVar357 * fVar410 - fVar365 * fVar425);
          auVar316._4_4_ = fVar328;
          auVar316._0_4_ = fVar325;
          fVar344 = (fVar369 * fVar381 - fVar307 * fVar148) * 0.0 +
                    (fVar307 * fVar441 - fVar361 * fVar381) * 0.0 +
                    (fVar361 * fVar148 - fVar369 * fVar441);
          fVar363 = (fVar373 * fVar413 - fVar322 * fVar219) * 0.0 +
                    (fVar322 * fVar367 - fVar362 * fVar413) * 0.0 +
                    (fVar362 * fVar219 - fVar373 * fVar367);
          auVar429._0_4_ =
               (fVar270 * fVar268 - fVar378 * fVar423) * 0.0 +
               (fVar378 * fVar430 - fVar424 * fVar268) * 0.0 +
               (fVar424 * fVar423 - fVar270 * fVar430);
          auVar429._4_4_ =
               (fVar331 * fVar321 - fVar380 * fVar147) * 0.0 +
               (fVar380 * fVar435 - fVar426 * fVar321) * 0.0 +
               (fVar426 * fVar147 - fVar331 * fVar435);
          auVar429._8_4_ =
               (fVar343 * fVar341 - fVar412 * fVar221) * 0.0 +
               (fVar412 * fVar436 - fVar445 * fVar341) * 0.0 +
               (fVar445 * fVar221 - fVar343 * fVar436);
          auVar429._12_4_ =
               (fVar372 * fVar346 - fVar415 * fVar225) * 0.0 +
               (fVar415 * fVar438 - fVar402 * fVar346) * 0.0 +
               (fVar402 * fVar225 - fVar372 * fVar438);
          auVar316._8_4_ = fVar344;
          auVar316._12_4_ = fVar363;
          auVar177 = maxps(auVar316,auVar429);
          bVar100 = auVar177._0_4_ <= 0.0 && bVar100;
          auVar317._0_4_ = -(uint)bVar100;
          bVar101 = auVar177._4_4_ <= 0.0 && bVar101;
          auVar317._4_4_ = -(uint)bVar101;
          bVar95 = auVar177._8_4_ <= 0.0 && bVar95;
          auVar317._8_4_ = -(uint)bVar95;
          bVar90 = auVar177._12_4_ <= 0.0 && bVar90;
          auVar317._12_4_ = -(uint)bVar90;
          iVar214 = movmskps((int)(catmullrom_basis1 + lVar132),auVar317);
          if (iVar214 == 0) {
LAB_003c9566:
            auVar299._8_8_ = uStack_3d0;
            auVar299._0_8_ = local_3d8;
          }
          else {
            fVar343 = fVar423 * fVar375 - fVar268 * fVar371;
            fVar372 = fVar147 * fVar379 - fVar321 * fVar410;
            fVar378 = fVar221 * fVar381 - fVar341 * fVar148;
            fVar380 = fVar225 * fVar413 - fVar346 * fVar219;
            fVar270 = fVar268 * fVar422 - fVar375 * fVar430;
            fVar321 = fVar321 * fVar425 - fVar379 * fVar435;
            fVar331 = fVar341 * fVar441 - fVar381 * fVar436;
            fVar341 = fVar346 * fVar367 - fVar413 * fVar438;
            fVar423 = fVar430 * fVar371 - fVar423 * fVar422;
            fVar346 = fVar435 * fVar410 - fVar147 * fVar425;
            fVar375 = fVar436 * fVar148 - fVar221 * fVar441;
            fVar379 = fVar438 * fVar219 - fVar225 * fVar367;
            auVar298._0_4_ = fVar270 * 0.0 + fVar423;
            auVar298._4_4_ = fVar321 * 0.0 + fVar346;
            auVar298._8_4_ = fVar331 * 0.0 + fVar375;
            auVar298._12_4_ = fVar341 * 0.0 + fVar379;
            auVar359._0_4_ = fVar343 * 0.0 + auVar298._0_4_;
            auVar359._4_4_ = fVar372 * 0.0 + auVar298._4_4_;
            auVar359._8_4_ = fVar378 * 0.0 + auVar298._8_4_;
            auVar359._12_4_ = fVar380 * 0.0 + auVar298._12_4_;
            auVar177 = rcpps(auVar298,auVar359);
            fVar147 = auVar177._0_4_;
            fVar221 = auVar177._4_4_;
            fVar225 = auVar177._8_4_;
            fVar268 = auVar177._12_4_;
            fVar147 = (1.0 - auVar359._0_4_ * fVar147) * fVar147 + fVar147;
            fVar221 = (1.0 - auVar359._4_4_ * fVar221) * fVar221 + fVar221;
            fVar225 = (1.0 - auVar359._8_4_ * fVar225) * fVar225 + fVar225;
            fVar268 = (1.0 - auVar359._12_4_ * fVar268) * fVar268 + fVar268;
            fVar270 = (fVar222 * fVar423 + fVar376 * fVar270 + fVar345 * fVar343) * fVar147;
            fVar321 = (fVar224 * fVar346 + fVar365 * fVar321 + fVar357 * fVar372) * fVar221;
            fVar331 = (fVar307 * fVar375 + fVar369 * fVar331 + fVar361 * fVar378) * fVar225;
            fVar341 = (fVar322 * fVar379 + fVar373 * fVar341 + fVar362 * fVar380) * fVar268;
            fVar423 = *(float *)(ray + k * 4 + 0x80);
            bVar100 = ((float)local_388._0_4_ <= fVar270 && fVar270 <= fVar423) && bVar100;
            auVar339._0_4_ = -(uint)bVar100;
            bVar101 = ((float)local_388._4_4_ <= fVar321 && fVar321 <= fVar423) && bVar101;
            auVar339._4_4_ = -(uint)bVar101;
            bVar95 = (fStack_380 <= fVar331 && fVar331 <= fVar423) && bVar95;
            auVar339._8_4_ = -(uint)bVar95;
            bVar90 = (fStack_37c <= fVar341 && fVar341 <= fVar423) && bVar90;
            auVar339._12_4_ = -(uint)bVar90;
            iVar214 = movmskps(iVar214,auVar339);
            if (iVar214 == 0) goto LAB_003c9566;
            auVar340._0_8_ =
                 CONCAT44(-(uint)(auVar359._4_4_ != 0.0 && bVar101),
                          -(uint)(auVar359._0_4_ != 0.0 && bVar100));
            auVar340._8_4_ = -(uint)(auVar359._8_4_ != 0.0 && bVar95);
            auVar340._12_4_ = -(uint)(auVar359._12_4_ != 0.0 && bVar90);
            iVar214 = movmskps(iVar214,auVar340);
            auVar299._8_8_ = uStack_3d0;
            auVar299._0_8_ = local_3d8;
            if (iVar214 != 0) {
              fVar325 = fVar325 * fVar147;
              fVar328 = fVar328 * fVar221;
              fVar344 = fVar344 * fVar225;
              fVar363 = fVar363 * fVar268;
              local_438 = (float)((uint)(1.0 - fVar325) & uVar140 | ~uVar140 & (uint)fVar325);
              fStack_434 = (float)((uint)(1.0 - fVar328) & uVar142 | ~uVar142 & (uint)fVar328);
              fStack_430 = (float)((uint)(1.0 - fVar344) & uVar143 | ~uVar143 & (uint)fVar344);
              fStack_42c = (float)((uint)(1.0 - fVar363) & uVar144 | ~uVar144 & (uint)fVar363);
              local_288 = (float)(~uVar140 & (uint)(auVar429._0_4_ * fVar147) |
                                 (uint)(1.0 - auVar429._0_4_ * fVar147) & uVar140);
              fStack_284 = (float)(~uVar142 & (uint)(auVar429._4_4_ * fVar221) |
                                  (uint)(1.0 - auVar429._4_4_ * fVar221) & uVar142);
              fStack_280 = (float)(~uVar143 & (uint)(auVar429._8_4_ * fVar225) |
                                  (uint)(1.0 - auVar429._8_4_ * fVar225) & uVar143);
              fStack_27c = (float)(~uVar144 & (uint)(auVar429._12_4_ * fVar268) |
                                  (uint)(1.0 - auVar429._12_4_ * fVar268) & uVar144);
              auVar299._8_4_ = auVar340._8_4_;
              auVar299._0_8_ = auVar340._0_8_;
              auVar299._12_4_ = auVar340._12_4_;
              local_348 = fVar270;
              fStack_344 = fVar321;
              fStack_340 = fVar331;
              fStack_33c = fVar341;
            }
          }
          iVar214 = movmskps(iVar214,auVar299);
          if (iVar214 != 0) {
            fVar147 = (auVar428._0_4_ - auVar433._0_4_) * local_438 + auVar433._0_4_;
            fVar221 = (auVar428._4_4_ - auVar433._4_4_) * fStack_434 + auVar433._4_4_;
            fVar225 = (auVar428._8_4_ - auVar433._8_4_) * fStack_430 + auVar433._8_4_;
            fVar268 = (auVar428._12_4_ - auVar433._12_4_) * fStack_42c + auVar433._12_4_;
            fVar423 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            aVar206._0_4_ = -(uint)(fVar423 * (fVar147 + fVar147) < local_348) & auVar299._0_4_;
            aVar206._4_4_ = -(uint)(fVar423 * (fVar221 + fVar221) < fStack_344) & auVar299._4_4_;
            aVar206._8_4_ = -(uint)(fVar423 * (fVar225 + fVar225) < fStack_340) & auVar299._8_4_;
            aVar206._12_4_ = -(uint)(fVar423 * (fVar268 + fVar268) < fStack_33c) & auVar299._12_4_;
            iVar214 = movmskps((int)pre,(undefined1  [16])aVar206);
            if (iVar214 != 0) {
              local_288 = local_288 + local_288 + -1.0;
              fStack_284 = fStack_284 + fStack_284 + -1.0;
              fStack_280 = fStack_280 + fStack_280 + -1.0;
              fStack_27c = fStack_27c + fStack_27c + -1.0;
              bhit.U.field_0.v[1] = fStack_434;
              bhit.U.field_0.v[0] = local_438;
              bhit.U.field_0.v[2] = fStack_430;
              bhit.U.field_0.v[3] = fStack_42c;
              bhit.T.field_0.v[1] = fStack_344;
              bhit.T.field_0.v[0] = local_348;
              bhit.T.field_0.v[2] = fStack_340;
              bhit.T.field_0.v[3] = fStack_33c;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fStack_394,local_398);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fStack_38c,fStack_390);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_3a4,local_3a8);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fStack_39c,fStack_3a0);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_3b4,local_3b8);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fStack_3ac,fStack_3b0);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_3c4,local_3c8);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fStack_3bc,fStack_3c0);
              pGVar134 = (context->scene->geometries).items[(long)local_3e0].ptr;
              pRVar133 = local_3e0;
              bhit.V.field_0.v[0] = local_288;
              bhit.V.field_0.v[1] = fStack_284;
              bhit.V.field_0.v[2] = fStack_280;
              bhit.V.field_0.v[3] = fStack_27c;
              bhit.i = uVar141;
              bhit.N = iVar305;
              bhit.valid.field_0 = aVar206;
              if ((pGVar134->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar423 = (float)(int)uVar141;
                bhit.vu.field_0.v[0] = (fVar423 + local_438 + 0.0) * local_68;
                bhit.vu.field_0.v[1] = (fVar423 + fStack_434 + 1.0) * fStack_64;
                bhit.vu.field_0.v[2] = (fVar423 + fStack_430 + 2.0) * fStack_60;
                bhit.vu.field_0.v[3] = (fVar423 + fStack_42c + 3.0) * fStack_5c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_284,local_288);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_27c,fStack_280);
                bhit.vt.field_0.v[1] = fStack_344;
                bhit.vt.field_0.v[0] = local_348;
                bhit.vt.field_0.v[2] = fStack_340;
                bhit.vt.field_0.v[3] = fStack_33c;
                auVar255._0_4_ = aVar206._0_4_ & (uint)local_348;
                auVar255._4_4_ = aVar206._4_4_ & (uint)fStack_344;
                auVar255._8_4_ = aVar206._8_4_ & (uint)fStack_340;
                auVar255._12_4_ = aVar206._12_4_ & (uint)fStack_33c;
                auVar300._0_8_ = CONCAT44(~aVar206._4_4_,~aVar206._0_4_) & 0x7f8000007f800000;
                auVar300._8_4_ = ~aVar206._8_4_ & 0x7f800000;
                auVar300._12_4_ = ~aVar206._12_4_ & 0x7f800000;
                auVar300 = auVar300 | auVar255;
                auVar318._4_4_ = auVar300._0_4_;
                auVar318._0_4_ = auVar300._4_4_;
                auVar318._8_4_ = auVar300._12_4_;
                auVar318._12_4_ = auVar300._8_4_;
                auVar177 = minps(auVar318,auVar300);
                auVar256._0_8_ = auVar177._8_8_;
                auVar256._8_4_ = auVar177._0_4_;
                auVar256._12_4_ = auVar177._4_4_;
                auVar177 = minps(auVar256,auVar177);
                auVar257._0_8_ =
                     CONCAT44(-(uint)(auVar177._4_4_ == auVar300._4_4_) & aVar206._4_4_,
                              -(uint)(auVar177._0_4_ == auVar300._0_4_) & aVar206._0_4_);
                auVar257._8_4_ = -(uint)(auVar177._8_4_ == auVar300._8_4_) & aVar206._8_4_;
                auVar257._12_4_ = -(uint)(auVar177._12_4_ == auVar300._12_4_) & aVar206._12_4_;
                iVar214 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar257);
                aVar207 = aVar206;
                if (iVar214 != 0) {
                  aVar207.i[2] = auVar257._8_4_;
                  aVar207._0_8_ = auVar257._0_8_;
                  aVar207.i[3] = auVar257._12_4_;
                }
                uVar140 = movmskps(iVar214,(undefined1  [16])aVar207);
                lVar137 = 0;
                if (uVar140 != 0) {
                  for (; (uVar140 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
                  }
                }
                valid.field_0 = aVar206;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar134->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar423 = bhit.vu.field_0.v[lVar137];
                  fVar221 = 1.0 - fVar423;
                  fVar147 = fVar423 * 3.0;
                  fVar270 = ((fVar147 + 2.0) * (fVar221 + fVar221) + fVar221 * -3.0 * fVar221) * 0.5
                  ;
                  fVar225 = (fVar221 * -2.0 * fVar423 + fVar423 * fVar423) * 0.5;
                  fVar268 = (fVar423 * fVar147 + (fVar147 + -5.0) * (fVar423 + fVar423)) * 0.5;
                  fVar147 = bhit.vv.field_0.v[lVar137];
                  fVar221 = (fVar423 * (fVar221 + fVar221) - fVar221 * fVar221) * 0.5;
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar137];
                  *(float *)(ray + k * 4 + 0xc0) =
                       fVar221 * local_398 +
                       fVar268 * local_3a8 + fVar270 * local_3b8 + fVar225 * local_3c8;
                  *(float *)(ray + k * 4 + 0xd0) =
                       fVar221 * fStack_394 +
                       fVar268 * fStack_3a4 + fVar270 * fStack_3b4 + fVar225 * fStack_3c4;
                  *(float *)(ray + k * 4 + 0xe0) =
                       fVar221 * fStack_390 +
                       fVar268 * fStack_3a0 + fVar270 * fStack_3b0 + fVar225 * fStack_3c0;
                  *(float *)(ray + k * 4 + 0xf0) = fVar423;
                  *(float *)(ray + k * 4 + 0x100) = fVar147;
                  *(uint *)(ray + k * 4 + 0x110) = uVar139;
                  *(int *)(ray + k * 4 + 0x120) = (int)local_3e0;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  pRVar133 = (RTCIntersectArguments *)context;
                }
                else {
                  auVar177 = *(undefined1 (*) [16])
                              (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  _local_528 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  while( true ) {
                    local_c8 = bhit.vu.field_0.v[lVar137];
                    local_b8 = bhit.vv.field_0.v[lVar137];
                    *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[lVar137];
                    fVar268 = 1.0 - local_c8;
                    fVar423 = local_c8 * 3.0;
                    fVar225 = ((fVar423 + 2.0) * (fVar268 + fVar268) + fVar268 * -3.0 * fVar268) *
                              0.5;
                    fVar147 = (local_c8 * local_c8 + fVar268 * -2.0 * local_c8) * 0.5;
                    fVar221 = (local_c8 * fVar423 + (fVar423 + -5.0) * (local_c8 + local_c8)) * 0.5;
                    args.context = context->user;
                    fVar423 = (local_c8 * (fVar268 + fVar268) - fVar268 * fVar268) * 0.5;
                    local_f8 = fVar423 * local_398 +
                               fVar221 * local_3a8 + fVar225 * local_3b8 + fVar147 * local_3c8;
                    local_e8 = fVar423 * fStack_394 +
                               fVar221 * fStack_3a4 + fVar225 * fStack_3b4 + fVar147 * fStack_3c4;
                    local_d8 = fVar423 * fStack_390 +
                               fVar221 * fStack_3a0 + fVar225 * fStack_3b0 + fVar147 * fStack_3c0;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    fStack_c4 = local_c8;
                    fStack_c0 = local_c8;
                    fStack_bc = local_c8;
                    fStack_b4 = local_b8;
                    fStack_b0 = local_b8;
                    fStack_ac = local_b8;
                    local_a8 = local_2c8;
                    uStack_a0 = uStack_2c0;
                    local_98 = local_2b8;
                    uStack_90 = uStack_2b0;
                    local_88 = (args.context)->instID[0];
                    uStack_84 = local_88;
                    uStack_80 = local_88;
                    uStack_7c = local_88;
                    local_78 = (args.context)->instPrimID[0];
                    uStack_74 = local_78;
                    uStack_70 = local_78;
                    uStack_6c = local_78;
                    args.valid = (int *)local_3f8;
                    pRVar133 = (RTCIntersectArguments *)pGVar134->userPtr;
                    args.hit = (RTCHitN *)&local_f8;
                    args.N = 4;
                    p_Var128 = pGVar134->intersectionFilterN;
                    local_3f8 = auVar177;
                    args.geometryUserPtr = pRVar133;
                    args.ray = (RTCRayN *)ray;
                    if (p_Var128 != (RTCFilterFunctionN)0x0) {
                      p_Var128 = (RTCFilterFunctionN)(*p_Var128)(&args);
                    }
                    auVar258._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                    auVar258._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                    auVar258._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                    auVar258._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                    uVar140 = movmskps((int)p_Var128,auVar258);
                    pRVar129 = (RTCRayN *)(ulong)(uVar140 ^ 0xf);
                    if ((uVar140 ^ 0xf) == 0) {
                      auVar258 = auVar258 ^ _DAT_01f46b70;
                    }
                    else {
                      pRVar133 = context->args;
                      pRVar130 = (RTCIntersectArguments *)pRVar133->filter;
                      if ((pRVar130 != (RTCIntersectArguments *)0x0) &&
                         ((((ulong)*(Scene **)&pRVar133->flags & 2) != 0 ||
                          (((pGVar134->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar130 = (RTCIntersectArguments *)(*(code *)pRVar130)(&args);
                      }
                      auVar208._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                      auVar208._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                      auVar208._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                      auVar208._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                      auVar258 = auVar208 ^ _DAT_01f46b70;
                      uVar140 = movmskps((int)pRVar130,auVar208);
                      pRVar129 = (RTCRayN *)(ulong)(uVar140 ^ 0xf);
                      if ((uVar140 ^ 0xf) != 0) {
                        uVar140 = *(uint *)(args.hit + 4);
                        uVar141 = *(uint *)(args.hit + 8);
                        uVar142 = *(uint *)(args.hit + 0xc);
                        *(uint *)(args.ray + 0xc0) =
                             ~auVar208._0_4_ & *(uint *)args.hit |
                             *(uint *)(args.ray + 0xc0) & auVar208._0_4_;
                        *(uint *)(args.ray + 0xc4) =
                             ~auVar208._4_4_ & uVar140 | *(uint *)(args.ray + 0xc4) & auVar208._4_4_
                        ;
                        *(uint *)(args.ray + 200) =
                             ~auVar208._8_4_ & uVar141 | *(uint *)(args.ray + 200) & auVar208._8_4_;
                        *(uint *)(args.ray + 0xcc) =
                             ~auVar208._12_4_ & uVar142 |
                             *(uint *)(args.ray + 0xcc) & auVar208._12_4_;
                        uVar140 = *(uint *)(args.hit + 0x14);
                        uVar141 = *(uint *)(args.hit + 0x18);
                        uVar142 = *(uint *)(args.hit + 0x1c);
                        *(uint *)(args.ray + 0xd0) =
                             ~auVar208._0_4_ & *(uint *)(args.hit + 0x10) |
                             *(uint *)(args.ray + 0xd0) & auVar208._0_4_;
                        *(uint *)(args.ray + 0xd4) =
                             ~auVar208._4_4_ & uVar140 | *(uint *)(args.ray + 0xd4) & auVar208._4_4_
                        ;
                        *(uint *)(args.ray + 0xd8) =
                             ~auVar208._8_4_ & uVar141 | *(uint *)(args.ray + 0xd8) & auVar208._8_4_
                        ;
                        *(uint *)(args.ray + 0xdc) =
                             ~auVar208._12_4_ & uVar142 |
                             *(uint *)(args.ray + 0xdc) & auVar208._12_4_;
                        uVar140 = *(uint *)(args.hit + 0x24);
                        uVar141 = *(uint *)(args.hit + 0x28);
                        uVar142 = *(uint *)(args.hit + 0x2c);
                        *(uint *)(args.ray + 0xe0) =
                             ~auVar208._0_4_ & *(uint *)(args.hit + 0x20) |
                             *(uint *)(args.ray + 0xe0) & auVar208._0_4_;
                        *(uint *)(args.ray + 0xe4) =
                             ~auVar208._4_4_ & uVar140 | *(uint *)(args.ray + 0xe4) & auVar208._4_4_
                        ;
                        *(uint *)(args.ray + 0xe8) =
                             ~auVar208._8_4_ & uVar141 | *(uint *)(args.ray + 0xe8) & auVar208._8_4_
                        ;
                        *(uint *)(args.ray + 0xec) =
                             ~auVar208._12_4_ & uVar142 |
                             *(uint *)(args.ray + 0xec) & auVar208._12_4_;
                        uVar140 = *(uint *)(args.hit + 0x34);
                        uVar141 = *(uint *)(args.hit + 0x38);
                        uVar142 = *(uint *)(args.hit + 0x3c);
                        *(uint *)(args.ray + 0xf0) =
                             ~auVar208._0_4_ & *(uint *)(args.hit + 0x30) |
                             *(uint *)(args.ray + 0xf0) & auVar208._0_4_;
                        *(uint *)(args.ray + 0xf4) =
                             ~auVar208._4_4_ & uVar140 | *(uint *)(args.ray + 0xf4) & auVar208._4_4_
                        ;
                        *(uint *)(args.ray + 0xf8) =
                             ~auVar208._8_4_ & uVar141 | *(uint *)(args.ray + 0xf8) & auVar208._8_4_
                        ;
                        *(uint *)(args.ray + 0xfc) =
                             ~auVar208._12_4_ & uVar142 |
                             *(uint *)(args.ray + 0xfc) & auVar208._12_4_;
                        uVar140 = *(uint *)(args.hit + 0x44);
                        uVar141 = *(uint *)(args.hit + 0x48);
                        uVar142 = *(uint *)(args.hit + 0x4c);
                        *(uint *)(args.ray + 0x100) =
                             ~auVar208._0_4_ & *(uint *)(args.hit + 0x40) |
                             *(uint *)(args.ray + 0x100) & auVar208._0_4_;
                        *(uint *)(args.ray + 0x104) =
                             ~auVar208._4_4_ & uVar140 |
                             *(uint *)(args.ray + 0x104) & auVar208._4_4_;
                        *(uint *)(args.ray + 0x108) =
                             ~auVar208._8_4_ & uVar141 |
                             *(uint *)(args.ray + 0x108) & auVar208._8_4_;
                        *(uint *)(args.ray + 0x10c) =
                             ~auVar208._12_4_ & uVar142 |
                             *(uint *)(args.ray + 0x10c) & auVar208._12_4_;
                        uVar140 = *(uint *)(args.hit + 0x54);
                        uVar141 = *(uint *)(args.hit + 0x58);
                        uVar142 = *(uint *)(args.hit + 0x5c);
                        *(uint *)(args.ray + 0x110) =
                             *(uint *)(args.ray + 0x110) & auVar208._0_4_ |
                             ~auVar208._0_4_ & *(uint *)(args.hit + 0x50);
                        *(uint *)(args.ray + 0x114) =
                             *(uint *)(args.ray + 0x114) & auVar208._4_4_ |
                             ~auVar208._4_4_ & uVar140;
                        *(uint *)(args.ray + 0x118) =
                             *(uint *)(args.ray + 0x118) & auVar208._8_4_ |
                             ~auVar208._8_4_ & uVar141;
                        *(uint *)(args.ray + 0x11c) =
                             *(uint *)(args.ray + 0x11c) & auVar208._12_4_ |
                             ~auVar208._12_4_ & uVar142;
                        uVar140 = *(uint *)(args.hit + 100);
                        uVar141 = *(uint *)(args.hit + 0x68);
                        uVar142 = *(uint *)(args.hit + 0x6c);
                        *(uint *)(args.ray + 0x120) =
                             *(uint *)(args.ray + 0x120) & auVar208._0_4_ |
                             ~auVar208._0_4_ & *(uint *)(args.hit + 0x60);
                        *(uint *)(args.ray + 0x124) =
                             *(uint *)(args.ray + 0x124) & auVar208._4_4_ |
                             ~auVar208._4_4_ & uVar140;
                        *(uint *)(args.ray + 0x128) =
                             *(uint *)(args.ray + 0x128) & auVar208._8_4_ |
                             ~auVar208._8_4_ & uVar141;
                        *(uint *)(args.ray + 300) =
                             *(uint *)(args.ray + 300) & auVar208._12_4_ |
                             ~auVar208._12_4_ & uVar142;
                        uVar140 = *(uint *)(args.hit + 0x74);
                        uVar141 = *(uint *)(args.hit + 0x78);
                        uVar142 = *(uint *)(args.hit + 0x7c);
                        *(uint *)(args.ray + 0x130) =
                             ~auVar208._0_4_ & *(uint *)(args.hit + 0x70) |
                             *(uint *)(args.ray + 0x130) & auVar208._0_4_;
                        *(uint *)(args.ray + 0x134) =
                             ~auVar208._4_4_ & uVar140 |
                             *(uint *)(args.ray + 0x134) & auVar208._4_4_;
                        *(uint *)(args.ray + 0x138) =
                             ~auVar208._8_4_ & uVar141 |
                             *(uint *)(args.ray + 0x138) & auVar208._8_4_;
                        *(uint *)(args.ray + 0x13c) =
                             ~auVar208._12_4_ & uVar142 |
                             *(uint *)(args.ray + 0x13c) & auVar208._12_4_;
                        *(undefined1 (*) [16])(args.ray + 0x140) =
                             ~auVar208 & *(undefined1 (*) [16])(args.hit + 0x80) |
                             *(undefined1 (*) [16])(args.ray + 0x140) & auVar208;
                        pRVar129 = args.ray;
                        pRVar133 = (RTCIntersectArguments *)args.hit;
                      }
                    }
                    auVar259._0_4_ = auVar258._0_4_ << 0x1f;
                    auVar259._4_4_ = auVar258._4_4_ << 0x1f;
                    auVar259._8_4_ = auVar258._8_4_ << 0x1f;
                    auVar259._12_4_ = auVar258._12_4_ << 0x1f;
                    iVar214 = movmskps((int)pRVar129,auVar259);
                    if (iVar214 == 0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_528._0_4_;
                    }
                    else {
                      local_528._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      register0x00001244 = 0.0;
                      fStack_520 = 0.0;
                      uStack_51c = 0;
                    }
                    *(undefined4 *)(local_3f8 + lVar137 * 4 + -0x10) = 0;
                    valid.field_0.i[0] =
                         -(uint)(local_348 <= (float)local_528._0_4_) & valid.field_0.i[0];
                    valid.field_0.i[1] =
                         -(uint)(fStack_344 <= (float)local_528._0_4_) & valid.field_0.i[1];
                    valid.field_0.i[2] =
                         -(uint)(fStack_340 <= (float)local_528._0_4_) & valid.field_0.i[2];
                    valid.field_0.i[3] =
                         -(uint)(fStack_33c <= (float)local_528._0_4_) & valid.field_0.i[3];
                    iVar214 = movmskps(iVar214,(undefined1  [16])valid.field_0);
                    if (iVar214 == 0) break;
                    auVar260._0_4_ = valid.field_0.i[0] & (uint)local_348;
                    auVar260._4_4_ = valid.field_0.i[1] & (uint)fStack_344;
                    auVar260._8_4_ = valid.field_0.i[2] & (uint)fStack_340;
                    auVar260._12_4_ = valid.field_0.i[3] & (uint)fStack_33c;
                    auVar301._0_8_ =
                         CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                    auVar301._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                    auVar301._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                    auVar301 = auVar301 | auVar260;
                    auVar319._4_4_ = auVar301._0_4_;
                    auVar319._0_4_ = auVar301._4_4_;
                    auVar319._8_4_ = auVar301._12_4_;
                    auVar319._12_4_ = auVar301._8_4_;
                    auVar227 = minps(auVar319,auVar301);
                    auVar261._0_8_ = auVar227._8_8_;
                    auVar261._8_4_ = auVar227._0_4_;
                    auVar261._12_4_ = auVar227._4_4_;
                    auVar227 = minps(auVar261,auVar227);
                    auVar262._0_8_ =
                         CONCAT44(-(uint)(auVar227._4_4_ == auVar301._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar227._0_4_ == auVar301._0_4_) & valid.field_0.i[0]);
                    auVar262._8_4_ = -(uint)(auVar227._8_4_ == auVar301._8_4_) & valid.field_0.i[2];
                    auVar262._12_4_ =
                         -(uint)(auVar227._12_4_ == auVar301._12_4_) & valid.field_0.i[3];
                    iVar214 = movmskps(iVar214,auVar262);
                    aVar209 = valid.field_0;
                    if (iVar214 != 0) {
                      aVar209.i[2] = auVar262._8_4_;
                      aVar209._0_8_ = auVar262._0_8_;
                      aVar209.i[3] = auVar262._12_4_;
                    }
                    uVar135 = movmskps(iVar214,(undefined1  [16])aVar209);
                    uVar131 = CONCAT44((int)((ulong)pRVar129 >> 0x20),uVar135);
                    lVar137 = 0;
                    if (uVar131 != 0) {
                      for (; (uVar131 >> lVar137 & 1) == 0; lVar137 = lVar137 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    fVar423 = *(float *)(ray + k * 4 + 0x80);
    auVar254._4_4_ = -(uint)(fStack_44 <= fVar423);
    auVar254._0_4_ = -(uint)(local_48 <= fVar423);
    auVar254._8_4_ = -(uint)(fStack_40 <= fVar423);
    auVar254._12_4_ = -(uint)(fStack_3c <= fVar423);
    uVar139 = movmskps(uVar135,auVar254);
    uVar136 = (ulong)((uint)uVar136 & (uint)uVar136 + 0xf & uVar139);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }